

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx2::CurveNiIntersectorK<4,4>::
     occluded_t<embree::avx2::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,4,8>,embree::avx2::Occluded1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [32];
  float *pfVar6;
  float *pfVar7;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar9;
  undefined1 auVar10 [32];
  Primitive PVar11;
  uint uVar12;
  int iVar13;
  Geometry *pGVar14;
  __int_type_conflict _Var15;
  RTCFilterFunctionN p_Var16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  long lVar26;
  long lVar27;
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [28];
  undefined1 auVar81 [28];
  byte bVar82;
  uint uVar83;
  uint uVar84;
  ulong uVar85;
  ulong uVar86;
  ulong uVar87;
  ulong uVar88;
  Geometry *geometry;
  long lVar89;
  ulong uVar90;
  undefined4 uVar91;
  undefined8 uVar92;
  float fVar107;
  vint4 bi_2;
  undefined1 auVar93 [16];
  float fVar105;
  float fVar109;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  float fVar111;
  float fVar112;
  float fVar113;
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  float fVar106;
  float fVar108;
  float fVar110;
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  vint4 bi_1;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar117 [16];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [64];
  float fVar130;
  float fVar131;
  undefined1 auVar132 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar141 [32];
  undefined1 auVar135 [16];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  vint4 ai_2;
  undefined1 auVar144 [16];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  vint4 ai;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  vint4 bi;
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar165 [64];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  float fVar172;
  float fVar173;
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  vint4 ai_1;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [64];
  undefined1 auVar182 [16];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [64];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [64];
  undefined4 uVar193;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  float fVar196;
  float fVar202;
  undefined1 auVar197 [16];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [64];
  undefined1 auVar201 [64];
  undefined1 auVar203 [64];
  undefined1 auVar204 [64];
  float fVar205;
  float fVar211;
  float fVar212;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  undefined1 auVar210 [64];
  float fVar217;
  float fVar219;
  undefined1 auVar218 [32];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_8> bhit;
  bool local_86d;
  undefined1 local_860 [32];
  undefined1 local_820 [32];
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  ulong local_7c8;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  float local_720;
  float fStack_71c;
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined1 (*local_658) [16];
  RTCFilterFunctionNArguments local_650;
  undefined1 local_620 [8];
  undefined8 uStack_618;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined8 local_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 local_570;
  undefined8 uStack_568;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  undefined1 auStack_530 [8];
  float fStack_528;
  int iStack_524;
  undefined1 local_520 [8];
  undefined8 uStack_518;
  undefined1 local_500 [32];
  LinearSpace3fa *local_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined1 local_4a0 [32];
  undefined1 local_480 [8];
  undefined8 uStack_478;
  undefined1 auStack_470 [8];
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined4 local_3f0;
  undefined4 uStack_3ec;
  undefined4 uStack_3e8;
  undefined4 uStack_3e4;
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined4 local_3b0;
  undefined4 uStack_3ac;
  undefined4 uStack_3a8;
  undefined4 uStack_3a4;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined1 local_390 [16];
  uint local_380;
  uint uStack_37c;
  uint uStack_378;
  uint uStack_374;
  uint uStack_370;
  uint uStack_36c;
  uint uStack_368;
  uint uStack_364;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined4 local_320;
  undefined4 uStack_31c;
  undefined4 uStack_318;
  undefined4 uStack_314;
  undefined4 local_310;
  undefined4 uStack_30c;
  undefined4 uStack_308;
  undefined4 uStack_304;
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  int local_280;
  int local_27c;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined1 local_220 [32];
  float local_200 [4];
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [8];
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  undefined1 local_140 [32];
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar158 [16];
  
  PVar11 = prim[1];
  uVar90 = (ulong)(byte)PVar11;
  auVar17 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar17 = vinsertps_avx(auVar17,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar18 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar18 = vinsertps_avx(auVar18,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar131 = *(float *)(prim + uVar90 * 0x19 + 0x12);
  auVar17 = vsubps_avx(auVar17,*(undefined1 (*) [16])(prim + uVar90 * 0x19 + 6));
  auVar93._0_4_ = fVar131 * auVar17._0_4_;
  auVar93._4_4_ = fVar131 * auVar17._4_4_;
  auVar93._8_4_ = fVar131 * auVar17._8_4_;
  auVar93._12_4_ = fVar131 * auVar17._12_4_;
  auVar156._0_4_ = fVar131 * auVar18._0_4_;
  auVar156._4_4_ = fVar131 * auVar18._4_4_;
  auVar156._8_4_ = fVar131 * auVar18._8_4_;
  auVar156._12_4_ = fVar131 * auVar18._12_4_;
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar90 * 4 + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar90 * 5 + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar90 * 6 + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar90 * 0xb + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar11 * 0xc) + 6)));
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar11 * 0xc + uVar90 + 6)));
  auVar23 = vcvtdq2ps_avx(auVar23);
  uVar85 = (ulong)(uint)((int)(uVar90 * 9) * 2);
  auVar96 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 + 6)));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar95 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 + uVar90 + 6)));
  auVar95 = vcvtdq2ps_avx(auVar95);
  uVar85 = (ulong)(uint)((int)(uVar90 * 5) << 2);
  auVar132 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 + 6)));
  auVar132 = vcvtdq2ps_avx(auVar132);
  auVar206._4_4_ = auVar156._0_4_;
  auVar206._0_4_ = auVar156._0_4_;
  auVar206._8_4_ = auVar156._0_4_;
  auVar206._12_4_ = auVar156._0_4_;
  auVar115 = vshufps_avx(auVar156,auVar156,0x55);
  auVar94 = vshufps_avx(auVar156,auVar156,0xaa);
  fVar131 = auVar94._0_4_;
  auVar194._0_4_ = fVar131 * auVar20._0_4_;
  fVar105 = auVar94._4_4_;
  auVar194._4_4_ = fVar105 * auVar20._4_4_;
  fVar107 = auVar94._8_4_;
  auVar194._8_4_ = fVar107 * auVar20._8_4_;
  fVar109 = auVar94._12_4_;
  auVar194._12_4_ = fVar109 * auVar20._12_4_;
  auVar188._0_4_ = auVar23._0_4_ * fVar131;
  auVar188._4_4_ = auVar23._4_4_ * fVar105;
  auVar188._8_4_ = auVar23._8_4_ * fVar107;
  auVar188._12_4_ = auVar23._12_4_ * fVar109;
  auVar177._0_4_ = auVar132._0_4_ * fVar131;
  auVar177._4_4_ = auVar132._4_4_ * fVar105;
  auVar177._8_4_ = auVar132._8_4_ * fVar107;
  auVar177._12_4_ = auVar132._12_4_ * fVar109;
  auVar94 = vfmadd231ps_fma(auVar194,auVar115,auVar18);
  auVar116 = vfmadd231ps_fma(auVar188,auVar115,auVar22);
  auVar115 = vfmadd231ps_fma(auVar177,auVar95,auVar115);
  auVar144 = vfmadd231ps_fma(auVar94,auVar206,auVar17);
  auVar116 = vfmadd231ps_fma(auVar116,auVar206,auVar21);
  auVar148 = vfmadd231ps_fma(auVar115,auVar96,auVar206);
  auVar207._4_4_ = auVar93._0_4_;
  auVar207._0_4_ = auVar93._0_4_;
  auVar207._8_4_ = auVar93._0_4_;
  auVar207._12_4_ = auVar93._0_4_;
  auVar115 = vshufps_avx(auVar93,auVar93,0x55);
  auVar94 = vshufps_avx(auVar93,auVar93,0xaa);
  fVar131 = auVar94._0_4_;
  auVar157._0_4_ = fVar131 * auVar20._0_4_;
  fVar105 = auVar94._4_4_;
  auVar157._4_4_ = fVar105 * auVar20._4_4_;
  fVar107 = auVar94._8_4_;
  auVar157._8_4_ = fVar107 * auVar20._8_4_;
  fVar109 = auVar94._12_4_;
  auVar157._12_4_ = fVar109 * auVar20._12_4_;
  auVar114._0_4_ = auVar23._0_4_ * fVar131;
  auVar114._4_4_ = auVar23._4_4_ * fVar105;
  auVar114._8_4_ = auVar23._8_4_ * fVar107;
  auVar114._12_4_ = auVar23._12_4_ * fVar109;
  auVar94._0_4_ = auVar132._0_4_ * fVar131;
  auVar94._4_4_ = auVar132._4_4_ * fVar105;
  auVar94._8_4_ = auVar132._8_4_ * fVar107;
  auVar94._12_4_ = auVar132._12_4_ * fVar109;
  auVar18 = vfmadd231ps_fma(auVar157,auVar115,auVar18);
  auVar20 = vfmadd231ps_fma(auVar114,auVar115,auVar22);
  auVar22 = vfmadd231ps_fma(auVar94,auVar115,auVar95);
  auVar23 = vfmadd231ps_fma(auVar18,auVar207,auVar17);
  auVar95 = vfmadd231ps_fma(auVar20,auVar207,auVar21);
  auVar132 = vfmadd231ps_fma(auVar22,auVar207,auVar96);
  local_2f0._8_4_ = 0x7fffffff;
  local_2f0._0_8_ = 0x7fffffff7fffffff;
  local_2f0._12_4_ = 0x7fffffff;
  auVar17 = vandps_avx(auVar144,local_2f0);
  auVar147._8_4_ = 0x219392ef;
  auVar147._0_8_ = 0x219392ef219392ef;
  auVar147._12_4_ = 0x219392ef;
  auVar17 = vcmpps_avx(auVar17,auVar147,1);
  auVar18 = vblendvps_avx(auVar144,auVar147,auVar17);
  auVar17 = vandps_avx(auVar116,local_2f0);
  auVar17 = vcmpps_avx(auVar17,auVar147,1);
  auVar20 = vblendvps_avx(auVar116,auVar147,auVar17);
  auVar17 = vandps_avx(auVar148,local_2f0);
  auVar17 = vcmpps_avx(auVar17,auVar147,1);
  auVar17 = vblendvps_avx(auVar148,auVar147,auVar17);
  auVar21 = vrcpps_avx(auVar18);
  auVar174._8_4_ = 0x3f800000;
  auVar174._0_8_ = &DAT_3f8000003f800000;
  auVar174._12_4_ = 0x3f800000;
  auVar18 = vfnmadd213ps_fma(auVar18,auVar21,auVar174);
  auVar21 = vfmadd132ps_fma(auVar18,auVar21,auVar21);
  auVar18 = vrcpps_avx(auVar20);
  auVar20 = vfnmadd213ps_fma(auVar20,auVar18,auVar174);
  auVar22 = vfmadd132ps_fma(auVar20,auVar18,auVar18);
  auVar18 = vrcpps_avx(auVar17);
  auVar20 = vfnmadd213ps_fma(auVar17,auVar18,auVar174);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar90 * 7 + 6);
  auVar17 = vpmovsxwd_avx(auVar17);
  auVar96 = vfmadd132ps_fma(auVar20,auVar18,auVar18);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar17 = vsubps_avx(auVar17,auVar23);
  auVar148._0_4_ = auVar21._0_4_ * auVar17._0_4_;
  auVar148._4_4_ = auVar21._4_4_ * auVar17._4_4_;
  auVar148._8_4_ = auVar21._8_4_ * auVar17._8_4_;
  auVar148._12_4_ = auVar21._12_4_ * auVar17._12_4_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar90 * 9 + 6);
  auVar17 = vpmovsxwd_avx(auVar18);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar17 = vsubps_avx(auVar17,auVar23);
  auVar158._0_4_ = auVar21._0_4_ * auVar17._0_4_;
  auVar158._4_4_ = auVar21._4_4_ * auVar17._4_4_;
  auVar158._8_4_ = auVar21._8_4_ * auVar17._8_4_;
  auVar158._12_4_ = auVar21._12_4_ * auVar17._12_4_;
  auVar165 = ZEXT1664(auVar158);
  auVar116._1_3_ = 0;
  auVar116[0] = PVar11;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar11 * 0x10 + 6);
  auVar18 = vpmovsxwd_avx(auVar20);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar11 * 0x10 + uVar90 * -2 + 6);
  auVar17 = vpmovsxwd_avx(auVar21);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar17 = vsubps_avx(auVar17,auVar95);
  auVar178._0_4_ = auVar17._0_4_ * auVar22._0_4_;
  auVar178._4_4_ = auVar17._4_4_ * auVar22._4_4_;
  auVar178._8_4_ = auVar17._8_4_ * auVar22._8_4_;
  auVar178._12_4_ = auVar17._12_4_ * auVar22._12_4_;
  auVar17 = vcvtdq2ps_avx(auVar18);
  auVar17 = vsubps_avx(auVar17,auVar95);
  auVar115._0_4_ = auVar22._0_4_ * auVar17._0_4_;
  auVar115._4_4_ = auVar22._4_4_ * auVar17._4_4_;
  auVar115._8_4_ = auVar22._8_4_ * auVar17._8_4_;
  auVar115._12_4_ = auVar22._12_4_ * auVar17._12_4_;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar85 + uVar90 + 6);
  auVar17 = vpmovsxwd_avx(auVar22);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar17 = vsubps_avx(auVar17,auVar132);
  auVar144._0_4_ = auVar96._0_4_ * auVar17._0_4_;
  auVar144._4_4_ = auVar96._4_4_ * auVar17._4_4_;
  auVar144._8_4_ = auVar96._8_4_ * auVar17._8_4_;
  auVar144._12_4_ = auVar96._12_4_ * auVar17._12_4_;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar90 * 0x17 + 6);
  auVar17 = vpmovsxwd_avx(auVar23);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar17 = vsubps_avx(auVar17,auVar132);
  auVar95._0_4_ = auVar96._0_4_ * auVar17._0_4_;
  auVar95._4_4_ = auVar96._4_4_ * auVar17._4_4_;
  auVar95._8_4_ = auVar96._8_4_ * auVar17._8_4_;
  auVar95._12_4_ = auVar96._12_4_ * auVar17._12_4_;
  auVar17 = vpminsd_avx(auVar148,auVar158);
  auVar18 = vpminsd_avx(auVar178,auVar115);
  auVar17 = vmaxps_avx(auVar17,auVar18);
  auVar18 = vpminsd_avx(auVar144,auVar95);
  uVar91 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar182._4_4_ = uVar91;
  auVar182._0_4_ = uVar91;
  auVar182._8_4_ = uVar91;
  auVar182._12_4_ = uVar91;
  auVar18 = vmaxps_avx(auVar18,auVar182);
  auVar17 = vmaxps_avx(auVar17,auVar18);
  local_300._0_4_ = auVar17._0_4_ * 0.99999964;
  local_300._4_4_ = auVar17._4_4_ * 0.99999964;
  local_300._8_4_ = auVar17._8_4_ * 0.99999964;
  local_300._12_4_ = auVar17._12_4_ * 0.99999964;
  auVar17 = vpmaxsd_avx(auVar148,auVar158);
  auVar18 = vpmaxsd_avx(auVar178,auVar115);
  auVar17 = vminps_avx(auVar17,auVar18);
  auVar18 = vpmaxsd_avx(auVar144,auVar95);
  uVar91 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar132._4_4_ = uVar91;
  auVar132._0_4_ = uVar91;
  auVar132._8_4_ = uVar91;
  auVar132._12_4_ = uVar91;
  auVar18 = vminps_avx(auVar18,auVar132);
  auVar17 = vminps_avx(auVar17,auVar18);
  auVar96._0_4_ = auVar17._0_4_ * 1.0000004;
  auVar96._4_4_ = auVar17._4_4_ * 1.0000004;
  auVar96._8_4_ = auVar17._8_4_ * 1.0000004;
  auVar96._12_4_ = auVar17._12_4_ * 1.0000004;
  auVar116[4] = PVar11;
  auVar116._5_3_ = 0;
  auVar116[8] = PVar11;
  auVar116._9_3_ = 0;
  auVar116[0xc] = PVar11;
  auVar116._13_3_ = 0;
  auVar18 = vpcmpgtd_avx(auVar116,_DAT_01ff0cf0);
  auVar17 = vcmpps_avx(local_300,auVar96,2);
  auVar17 = vandps_avx(auVar17,auVar18);
  uVar83 = vmovmskps_avx(auVar17);
  local_86d = uVar83 != 0;
  if (local_86d) {
    uVar83 = uVar83 & 0xff;
    local_4c8 = pre->ray_space + k;
    local_4c0 = mm_lookupmask_ps._16_8_;
    uStack_4b8 = mm_lookupmask_ps._24_8_;
    uStack_4b0 = mm_lookupmask_ps._16_8_;
    uStack_4a8 = mm_lookupmask_ps._24_8_;
    local_658 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
    do {
      auVar155 = local_420;
      local_780 = auVar165._0_32_;
      lVar26 = 0;
      uVar90 = (ulong)uVar83;
      for (uVar85 = uVar90; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x8000000000000000) {
        lVar26 = lVar26 + 1;
      }
      uVar83 = *(uint *)(prim + 2);
      local_7c8 = (ulong)uVar83;
      uVar12 = *(uint *)(prim + lVar26 * 4 + 6);
      pGVar14 = (context->scene->geometries).items[local_7c8].ptr;
      _Var15 = pGVar14[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      local_440._0_8_ = CONCAT44(0,uVar12);
      uVar85 = (ulong)*(uint *)(*(long *)&pGVar14->field_0x58 + _Var15 * CONCAT44(0,uVar12));
      p_Var16 = pGVar14[1].intersectionFilterN;
      lVar26 = *(long *)&pGVar14[1].time_range.upper;
      pauVar1 = (undefined1 (*) [16])(lVar26 + (long)p_Var16 * uVar85);
      local_6f0 = *(undefined8 *)*pauVar1;
      uStack_6e8 = *(undefined8 *)(*pauVar1 + 8);
      pauVar2 = (undefined1 (*) [16])(lVar26 + (uVar85 + 1) * (long)p_Var16);
      local_570 = *(undefined8 *)*pauVar2;
      uStack_568 = *(undefined8 *)(*pauVar2 + 8);
      uVar88 = (uVar85 + 2) * (long)p_Var16;
      pauVar3 = (undefined1 (*) [16])(lVar26 + uVar88);
      local_580 = *(undefined8 *)*pauVar3;
      uStack_578 = *(undefined8 *)(*pauVar3 + 8);
      uVar90 = uVar90 - 1 & uVar90;
      pauVar4 = (undefined1 (*) [16])(lVar26 + (uVar85 + 3) * (long)p_Var16);
      local_590 = *(undefined8 *)*pauVar4;
      uStack_588 = *(undefined8 *)(*pauVar4 + 8);
      if (uVar90 != 0) {
        uVar87 = uVar90 - 1 & uVar90;
        lVar26 = 0;
        for (uVar85 = uVar90; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x8000000000000000) {
          lVar26 = lVar26 + 1;
        }
        uVar88 = (ulong)*(uint *)(*(long *)&pGVar14->field_0x58 +
                                 *(uint *)(prim + lVar26 * 4 + 6) * _Var15) * (long)p_Var16;
        if (uVar87 != 0) {
          for (; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x8000000000000000) {
          }
        }
      }
      iVar13 = (int)pGVar14[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar17 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10))
                              ,0x1c);
      auVar21 = vinsertps_avx(auVar17,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      auVar18 = vsubps_avx(*pauVar1,auVar21);
      uVar91 = auVar18._0_4_;
      auVar149._4_4_ = uVar91;
      auVar149._0_4_ = uVar91;
      auVar149._8_4_ = uVar91;
      auVar149._12_4_ = uVar91;
      auVar17 = vshufps_avx(auVar18,auVar18,0x55);
      auVar18 = vshufps_avx(auVar18,auVar18,0xaa);
      aVar8 = (local_4c8->vx).field_0;
      aVar9 = (local_4c8->vy).field_0;
      fVar131 = (local_4c8->vz).field_0.m128[0];
      fVar105 = *(float *)((long)&(local_4c8->vz).field_0 + 4);
      fVar107 = *(float *)((long)&(local_4c8->vz).field_0 + 8);
      fVar109 = *(float *)((long)&(local_4c8->vz).field_0 + 0xc);
      auVar166._0_4_ = fVar131 * auVar18._0_4_;
      auVar166._4_4_ = fVar105 * auVar18._4_4_;
      auVar166._8_4_ = fVar107 * auVar18._8_4_;
      auVar166._12_4_ = fVar109 * auVar18._12_4_;
      auVar17 = vfmadd231ps_fma(auVar166,(undefined1  [16])aVar9,auVar17);
      auVar23 = vfmadd231ps_fma(auVar17,(undefined1  [16])aVar8,auVar149);
      auVar17 = vblendps_avx(auVar23,*pauVar1,8);
      auVar20 = vsubps_avx(*pauVar2,auVar21);
      uVar91 = auVar20._0_4_;
      auVar167._4_4_ = uVar91;
      auVar167._0_4_ = uVar91;
      auVar167._8_4_ = uVar91;
      auVar167._12_4_ = uVar91;
      auVar18 = vshufps_avx(auVar20,auVar20,0x55);
      auVar20 = vshufps_avx(auVar20,auVar20,0xaa);
      auVar189._0_4_ = fVar131 * auVar20._0_4_;
      auVar189._4_4_ = fVar105 * auVar20._4_4_;
      auVar189._8_4_ = fVar107 * auVar20._8_4_;
      auVar189._12_4_ = fVar109 * auVar20._12_4_;
      auVar18 = vfmadd231ps_fma(auVar189,(undefined1  [16])aVar9,auVar18);
      auVar96 = vfmadd231ps_fma(auVar18,(undefined1  [16])aVar8,auVar167);
      auVar18 = vblendps_avx(auVar96,*pauVar2,8);
      auVar22 = vsubps_avx(*pauVar3,auVar21);
      uVar91 = auVar22._0_4_;
      auVar175._4_4_ = uVar91;
      auVar175._0_4_ = uVar91;
      auVar175._8_4_ = uVar91;
      auVar175._12_4_ = uVar91;
      auVar20 = vshufps_avx(auVar22,auVar22,0x55);
      auVar22 = vshufps_avx(auVar22,auVar22,0xaa);
      auVar195._0_4_ = fVar131 * auVar22._0_4_;
      auVar195._4_4_ = fVar105 * auVar22._4_4_;
      auVar195._8_4_ = fVar107 * auVar22._8_4_;
      auVar195._12_4_ = fVar109 * auVar22._12_4_;
      auVar20 = vfmadd231ps_fma(auVar195,(undefined1  [16])aVar9,auVar20);
      auVar95 = vfmadd231ps_fma(auVar20,(undefined1  [16])aVar8,auVar175);
      auVar20 = vblendps_avx(auVar95,*pauVar3,8);
      auVar22 = vsubps_avx(*pauVar4,auVar21);
      uVar91 = auVar22._0_4_;
      auVar176._4_4_ = uVar91;
      auVar176._0_4_ = uVar91;
      auVar176._8_4_ = uVar91;
      auVar176._12_4_ = uVar91;
      auVar21 = vshufps_avx(auVar22,auVar22,0x55);
      auVar22 = vshufps_avx(auVar22,auVar22,0xaa);
      auVar197._0_4_ = fVar131 * auVar22._0_4_;
      auVar197._4_4_ = fVar105 * auVar22._4_4_;
      auVar197._8_4_ = fVar107 * auVar22._8_4_;
      auVar197._12_4_ = fVar109 * auVar22._12_4_;
      auVar21 = vfmadd231ps_fma(auVar197,(undefined1  [16])aVar9,auVar21);
      auVar132 = vfmadd231ps_fma(auVar21,(undefined1  [16])aVar8,auVar176);
      auVar21 = vblendps_avx(auVar132,*pauVar4,8);
      auVar17 = vandps_avx(auVar17,local_2f0);
      auVar18 = vandps_avx(auVar18,local_2f0);
      auVar22 = vmaxps_avx(auVar17,auVar18);
      auVar17 = vandps_avx(auVar20,local_2f0);
      auVar18 = vandps_avx(auVar21,local_2f0);
      auVar17 = vmaxps_avx(auVar17,auVar18);
      auVar17 = vmaxps_avx(auVar22,auVar17);
      auVar18 = vmovshdup_avx(auVar17);
      auVar18 = vmaxss_avx(auVar18,auVar17);
      auVar17 = vshufpd_avx(auVar17,auVar17,1);
      auVar17 = vmaxss_avx(auVar17,auVar18);
      lVar26 = (long)iVar13 * 0x44;
      auVar18 = vmovshdup_avx(auVar23);
      uVar92 = auVar18._0_8_;
      local_460._8_8_ = uVar92;
      local_460._0_8_ = uVar92;
      local_460._16_8_ = uVar92;
      local_460._24_8_ = uVar92;
      auVar10 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar26 + 0x484);
      auVar18 = vmovshdup_avx(auVar96);
      uVar92 = auVar18._0_8_;
      local_6a0._8_8_ = uVar92;
      local_6a0._0_8_ = uVar92;
      local_6a0._16_8_ = uVar92;
      local_6a0._24_8_ = uVar92;
      auVar164 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar26 + 0x908);
      uVar193 = auVar95._0_4_;
      local_7c0._4_4_ = uVar193;
      local_7c0._0_4_ = uVar193;
      local_7c0._8_4_ = uVar193;
      local_7c0._12_4_ = uVar193;
      local_7c0._16_4_ = uVar193;
      local_7c0._20_4_ = uVar193;
      local_7c0._24_4_ = uVar193;
      local_7c0._28_4_ = uVar193;
      auVar18 = vmovshdup_avx(auVar95);
      uVar92 = auVar18._0_8_;
      local_5e0._8_8_ = uVar92;
      local_5e0._0_8_ = uVar92;
      local_5e0._16_8_ = uVar92;
      local_5e0._24_8_ = uVar92;
      fVar105 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar26 + 0xd8c);
      fVar107 = *(float *)(catmullrom_basis0 + lVar26 + 0xd90);
      fVar109 = *(float *)(catmullrom_basis0 + lVar26 + 0xd94);
      fVar172 = *(float *)(catmullrom_basis0 + lVar26 + 0xd98);
      fVar173 = *(float *)(catmullrom_basis0 + lVar26 + 0xd9c);
      fVar130 = *(float *)(catmullrom_basis0 + lVar26 + 0xda0);
      fVar106 = *(float *)(catmullrom_basis0 + lVar26 + 0xda4);
      auVar80 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar26 + 0xd8c);
      local_720 = auVar132._0_4_;
      auVar18 = vmovshdup_avx(auVar132);
      local_680 = auVar18._0_8_;
      auVar124._0_4_ = fVar105 * local_720;
      auVar124._4_4_ = fVar107 * local_720;
      auVar124._8_4_ = fVar109 * local_720;
      auVar124._12_4_ = fVar172 * local_720;
      auVar124._16_4_ = fVar173 * local_720;
      auVar124._20_4_ = fVar130 * local_720;
      auVar124._24_4_ = fVar106 * local_720;
      auVar124._28_4_ = 0;
      fVar217 = auVar18._0_4_;
      auVar98._0_4_ = fVar217 * fVar105;
      fVar219 = auVar18._4_4_;
      auVar98._4_4_ = fVar219 * fVar107;
      auVar98._8_4_ = fVar217 * fVar109;
      auVar98._12_4_ = fVar219 * fVar172;
      auVar98._16_4_ = fVar217 * fVar173;
      auVar98._20_4_ = fVar219 * fVar130;
      auVar98._24_4_ = fVar217 * fVar106;
      auVar98._28_4_ = 0;
      auVar18 = vfmadd231ps_fma(auVar124,auVar164,local_7c0);
      auVar20 = vfmadd231ps_fma(auVar98,auVar164,local_5e0);
      uVar91 = auVar96._0_4_;
      local_740._4_4_ = uVar91;
      local_740._0_4_ = uVar91;
      local_740._8_4_ = uVar91;
      local_740._12_4_ = uVar91;
      local_740._16_4_ = uVar91;
      local_740._20_4_ = uVar91;
      local_740._24_4_ = uVar91;
      local_740._28_4_ = uVar91;
      auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar10,local_740);
      auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar10,local_6a0);
      auVar98 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar26);
      uVar91 = auVar23._0_4_;
      local_760._4_4_ = uVar91;
      local_760._0_4_ = uVar91;
      local_760._8_4_ = uVar91;
      local_760._12_4_ = uVar91;
      local_760._16_4_ = uVar91;
      local_760._20_4_ = uVar91;
      local_760._24_4_ = uVar91;
      local_760._28_4_ = uVar91;
      auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar98,local_760);
      auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar98,local_460);
      auVar124 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar26 + 0x908);
      fVar108 = *(float *)*(undefined1 (*) [28])(catmullrom_basis1 + lVar26 + 0xd8c);
      fVar110 = *(float *)(catmullrom_basis1 + lVar26 + 0xd90);
      fVar111 = *(float *)(catmullrom_basis1 + lVar26 + 0xd94);
      fVar112 = *(float *)(catmullrom_basis1 + lVar26 + 0xd98);
      fVar113 = *(float *)(catmullrom_basis1 + lVar26 + 0xd9c);
      fVar196 = *(float *)(catmullrom_basis1 + lVar26 + 0xda0);
      fVar202 = *(float *)(catmullrom_basis1 + lVar26 + 0xda4);
      auVar81 = *(undefined1 (*) [28])(catmullrom_basis1 + lVar26 + 0xd8c);
      auVar160._4_4_ = fVar110 * local_720;
      auVar160._0_4_ = fVar108 * local_720;
      auVar160._8_4_ = fVar111 * local_720;
      auVar160._12_4_ = fVar112 * local_720;
      auVar160._16_4_ = fVar113 * local_720;
      auVar160._20_4_ = fVar196 * local_720;
      auVar160._24_4_ = fVar202 * local_720;
      auVar160._28_4_ = local_720;
      auVar21 = vfmadd231ps_fma(auVar160,auVar124,local_7c0);
      auVar186._4_4_ = fVar219 * fVar110;
      auVar186._0_4_ = fVar217 * fVar108;
      auVar186._8_4_ = fVar217 * fVar111;
      auVar186._12_4_ = fVar219 * fVar112;
      auVar186._16_4_ = fVar217 * fVar113;
      auVar186._20_4_ = fVar219 * fVar196;
      auVar186._24_4_ = fVar217 * fVar202;
      auVar186._28_4_ = uVar193;
      auVar22 = vfmadd231ps_fma(auVar186,auVar124,local_5e0);
      auVar160 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar26 + 0x484);
      auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar160,local_740);
      auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar160,local_6a0);
      auVar186 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar26);
      auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar186,local_760);
      auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar186,local_460);
      auVar119 = ZEXT1632(auVar21);
      auVar168 = ZEXT1632(auVar18);
      auVar24 = vsubps_avx(auVar119,auVar168);
      auVar139 = ZEXT1632(auVar22);
      auVar99 = ZEXT1632(auVar20);
      auVar25 = vsubps_avx(auVar139,auVar99);
      auVar100._0_4_ = auVar20._0_4_ * auVar24._0_4_;
      auVar100._4_4_ = auVar20._4_4_ * auVar24._4_4_;
      auVar100._8_4_ = auVar20._8_4_ * auVar24._8_4_;
      auVar100._12_4_ = auVar20._12_4_ * auVar24._12_4_;
      auVar100._16_4_ = auVar24._16_4_ * 0.0;
      auVar100._20_4_ = auVar24._20_4_ * 0.0;
      auVar100._24_4_ = auVar24._24_4_ * 0.0;
      auVar100._28_4_ = 0;
      fVar205 = auVar25._0_4_;
      auVar120._0_4_ = fVar205 * auVar18._0_4_;
      fVar211 = auVar25._4_4_;
      auVar120._4_4_ = fVar211 * auVar18._4_4_;
      fVar212 = auVar25._8_4_;
      auVar120._8_4_ = fVar212 * auVar18._8_4_;
      fVar213 = auVar25._12_4_;
      auVar120._12_4_ = fVar213 * auVar18._12_4_;
      fVar214 = auVar25._16_4_;
      auVar120._16_4_ = fVar214 * 0.0;
      fVar215 = auVar25._20_4_;
      auVar120._20_4_ = fVar215 * 0.0;
      fVar216 = auVar25._24_4_;
      auVar120._24_4_ = fVar216 * 0.0;
      auVar120._28_4_ = 0;
      auVar100 = vsubps_avx(auVar100,auVar120);
      auVar18 = vpermilps_avx(*pauVar1,0xff);
      uVar92 = auVar18._0_8_;
      local_80._8_8_ = uVar92;
      local_80._0_8_ = uVar92;
      local_80._16_8_ = uVar92;
      local_80._24_8_ = uVar92;
      auVar20 = vpermilps_avx(*pauVar2,0xff);
      uVar92 = auVar20._0_8_;
      local_a0._8_8_ = uVar92;
      local_a0._0_8_ = uVar92;
      local_a0._16_8_ = uVar92;
      local_a0._24_8_ = uVar92;
      auVar20 = vpermilps_avx(*pauVar3,0xff);
      uVar92 = auVar20._0_8_;
      local_c0._8_8_ = uVar92;
      local_c0._0_8_ = uVar92;
      local_c0._16_8_ = uVar92;
      local_c0._24_8_ = uVar92;
      auVar20 = vpermilps_avx(*pauVar4,0xff);
      local_e0 = auVar20._0_8_;
      fVar131 = auVar20._0_4_;
      auVar169._0_4_ = fVar105 * fVar131;
      fVar105 = auVar20._4_4_;
      auVar169._4_4_ = fVar107 * fVar105;
      auVar169._8_4_ = fVar109 * fVar131;
      auVar169._12_4_ = fVar172 * fVar105;
      auVar169._16_4_ = fVar173 * fVar131;
      auVar169._20_4_ = fVar130 * fVar105;
      auVar169._24_4_ = fVar106 * fVar131;
      auVar169._28_4_ = 0;
      auVar20 = vfmadd231ps_fma(auVar169,local_c0,auVar164);
      auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),local_a0,auVar10);
      auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar98,local_80);
      uStack_d8 = local_e0;
      uStack_d0 = local_e0;
      uStack_c8 = local_e0;
      auVar19._4_4_ = fVar110 * fVar105;
      auVar19._0_4_ = fVar108 * fVar131;
      auVar19._8_4_ = fVar111 * fVar131;
      auVar19._12_4_ = fVar112 * fVar105;
      auVar19._16_4_ = fVar113 * fVar131;
      auVar19._20_4_ = fVar196 * fVar105;
      auVar19._24_4_ = fVar202 * fVar131;
      auVar19._28_4_ = auVar98._28_4_;
      auVar21 = vfmadd231ps_fma(auVar19,auVar124,local_c0);
      auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar160,local_a0);
      auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar186,local_80);
      auVar126._4_4_ = fVar211 * fVar211;
      auVar126._0_4_ = fVar205 * fVar205;
      auVar126._8_4_ = fVar212 * fVar212;
      auVar126._12_4_ = fVar213 * fVar213;
      auVar126._16_4_ = fVar214 * fVar214;
      auVar126._20_4_ = fVar215 * fVar215;
      auVar126._24_4_ = fVar216 * fVar216;
      auVar126._28_4_ = auVar18._4_4_;
      auVar18 = vfmadd231ps_fma(auVar126,auVar24,auVar24);
      auVar19 = vmaxps_avx(ZEXT1632(auVar20),ZEXT1632(auVar21));
      auVar127._4_4_ = auVar19._4_4_ * auVar19._4_4_ * auVar18._4_4_;
      auVar127._0_4_ = auVar19._0_4_ * auVar19._0_4_ * auVar18._0_4_;
      auVar127._8_4_ = auVar19._8_4_ * auVar19._8_4_ * auVar18._8_4_;
      auVar127._12_4_ = auVar19._12_4_ * auVar19._12_4_ * auVar18._12_4_;
      auVar127._16_4_ = auVar19._16_4_ * auVar19._16_4_ * 0.0;
      auVar127._20_4_ = auVar19._20_4_ * auVar19._20_4_ * 0.0;
      auVar127._24_4_ = auVar19._24_4_ * auVar19._24_4_ * 0.0;
      auVar127._28_4_ = auVar19._28_4_;
      auVar142._4_4_ = auVar100._4_4_ * auVar100._4_4_;
      auVar142._0_4_ = auVar100._0_4_ * auVar100._0_4_;
      auVar142._8_4_ = auVar100._8_4_ * auVar100._8_4_;
      auVar142._12_4_ = auVar100._12_4_ * auVar100._12_4_;
      auVar142._16_4_ = auVar100._16_4_ * auVar100._16_4_;
      auVar142._20_4_ = auVar100._20_4_ * auVar100._20_4_;
      auVar142._24_4_ = auVar100._24_4_ * auVar100._24_4_;
      auVar142._28_4_ = auVar100._28_4_;
      auVar19 = vcmpps_avx(auVar142,auVar127,2);
      fVar131 = auVar17._0_4_ * 4.7683716e-07;
      auVar101._0_4_ = (float)iVar13;
      local_420._4_12_ = auVar95._4_12_;
      local_420._0_4_ = auVar101._0_4_;
      local_420._16_16_ = auVar155._16_16_;
      auVar101._4_4_ = auVar101._0_4_;
      auVar101._8_4_ = auVar101._0_4_;
      auVar101._12_4_ = auVar101._0_4_;
      auVar101._16_4_ = auVar101._0_4_;
      auVar101._20_4_ = auVar101._0_4_;
      auVar101._24_4_ = auVar101._0_4_;
      auVar101._28_4_ = auVar101._0_4_;
      auVar155 = vcmpps_avx(_DAT_02020f40,auVar101,1);
      auVar18 = vpermilps_avx(auVar23,0xaa);
      uVar92 = auVar18._0_8_;
      local_4a0._8_8_ = uVar92;
      local_4a0._0_8_ = uVar92;
      local_4a0._16_8_ = uVar92;
      local_4a0._24_8_ = uVar92;
      auVar17 = vpermilps_avx(auVar96,0xaa);
      uVar92 = auVar17._0_8_;
      auVar218._8_8_ = uVar92;
      auVar218._0_8_ = uVar92;
      auVar218._16_8_ = uVar92;
      auVar218._24_8_ = uVar92;
      auVar17 = vshufps_avx(auVar95,auVar95,0xaa);
      uVar92 = auVar17._0_8_;
      local_140._8_8_ = uVar92;
      local_140._0_8_ = uVar92;
      local_140._16_8_ = uVar92;
      local_140._24_8_ = uVar92;
      auVar17 = vshufps_avx(auVar132,auVar132,0xaa);
      uVar92 = auVar17._0_8_;
      register0x00001508 = uVar92;
      local_560 = uVar92;
      register0x00001510 = uVar92;
      register0x00001518 = uVar92;
      auVar200 = ZEXT3264(_local_560);
      auVar100 = auVar155 & auVar19;
      uVar84 = *(uint *)(ray + k * 4 + 0x30);
      _local_7a0 = ZEXT416(uVar84);
      fVar105 = fVar217;
      fVar107 = fVar219;
      fVar109 = fVar217;
      fVar172 = fVar219;
      fVar173 = fVar217;
      fStack_71c = local_720;
      fStack_718 = local_720;
      fStack_714 = local_720;
      fStack_710 = local_720;
      fStack_70c = local_720;
      fStack_708 = local_720;
      fStack_704 = local_720;
      uStack_678 = local_680;
      uStack_670 = local_680;
      uStack_668 = local_680;
      if ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar100 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar100 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar100 >> 0x7f,0) == '\0') &&
            (auVar100 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar100 >> 0xbf,0) == '\0') &&
          (auVar100 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar100[0x1f]) {
        uVar88 = 0;
        auVar165 = ZEXT3264(local_780);
        auVar129 = ZEXT3264(local_6a0);
        auVar181 = ZEXT3264(local_7c0);
        auVar187 = ZEXT3264(local_5e0);
        auVar210 = ZEXT3264(local_740);
        auVar192 = ZEXT3264(local_760);
      }
      else {
        auVar19 = vandps_avx(auVar19,auVar155);
        local_620._0_4_ = auVar81._0_4_;
        local_620._4_4_ = auVar81._4_4_;
        uStack_618._0_4_ = auVar81._8_4_;
        uStack_618._4_4_ = auVar81._12_4_;
        fStack_610 = auVar81._16_4_;
        fStack_60c = auVar81._20_4_;
        fStack_608 = auVar81._24_4_;
        fVar196 = auVar17._0_4_;
        fVar202 = auVar17._4_4_;
        auVar155._4_4_ = fVar202 * (float)local_620._4_4_;
        auVar155._0_4_ = fVar196 * (float)local_620._0_4_;
        auVar155._8_4_ = fVar196 * (float)uStack_618;
        auVar155._12_4_ = fVar202 * uStack_618._4_4_;
        auVar155._16_4_ = fVar196 * fStack_610;
        auVar155._20_4_ = fVar202 * fStack_60c;
        auVar155._24_4_ = fVar196 * fStack_608;
        auVar155._28_4_ = auVar19._28_4_;
        auVar17 = vfmadd213ps_fma(auVar124,local_140,auVar155);
        auVar17 = vfmadd213ps_fma(auVar160,auVar218,ZEXT1632(auVar17));
        auVar17 = vfmadd213ps_fma(auVar186,local_4a0,ZEXT1632(auVar17));
        local_540._0_4_ = auVar80._0_4_;
        local_540._4_4_ = auVar80._4_4_;
        fStack_538 = auVar80._8_4_;
        fStack_534 = auVar80._12_4_;
        auStack_530._0_4_ = auVar80._16_4_;
        auStack_530._4_4_ = auVar80._20_4_;
        fStack_528 = auVar80._24_4_;
        auVar28._4_4_ = fVar202 * (float)local_540._4_4_;
        auVar28._0_4_ = fVar196 * (float)local_540._0_4_;
        auVar28._8_4_ = fVar196 * fStack_538;
        auVar28._12_4_ = fVar202 * fStack_534;
        auVar28._16_4_ = fVar196 * (float)auStack_530._0_4_;
        auVar28._20_4_ = fVar202 * (float)auStack_530._4_4_;
        auVar28._24_4_ = fVar196 * fStack_528;
        auVar28._28_4_ = auVar19._28_4_;
        auVar22 = vfmadd213ps_fma(auVar164,local_140,auVar28);
        auVar22 = vfmadd213ps_fma(auVar10,auVar218,ZEXT1632(auVar22));
        auVar155 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar26 + 0x1210);
        auVar10 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar26 + 0x1694);
        auVar164 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar26 + 0x1b18);
        fVar130 = *(float *)(catmullrom_basis0 + lVar26 + 0x1f9c);
        fVar106 = *(float *)(catmullrom_basis0 + lVar26 + 0x1fa0);
        fVar108 = *(float *)(catmullrom_basis0 + lVar26 + 0x1fa4);
        fVar110 = *(float *)(catmullrom_basis0 + lVar26 + 0x1fa8);
        fVar111 = *(float *)(catmullrom_basis0 + lVar26 + 0x1fac);
        fVar112 = *(float *)(catmullrom_basis0 + lVar26 + 0x1fb0);
        fVar113 = *(float *)(catmullrom_basis0 + lVar26 + 0x1fb4);
        auVar159._0_4_ = local_720 * fVar130;
        auVar159._4_4_ = local_720 * fVar106;
        auVar159._8_4_ = local_720 * fVar108;
        auVar159._12_4_ = local_720 * fVar110;
        auVar159._16_4_ = local_720 * fVar111;
        auVar159._20_4_ = local_720 * fVar112;
        auVar159._24_4_ = local_720 * fVar113;
        auVar159._28_4_ = 0;
        auVar179._0_4_ = fVar217 * fVar130;
        auVar179._4_4_ = fVar219 * fVar106;
        auVar179._8_4_ = fVar217 * fVar108;
        auVar179._12_4_ = fVar219 * fVar110;
        auVar179._16_4_ = fVar217 * fVar111;
        auVar179._20_4_ = fVar219 * fVar112;
        auVar179._24_4_ = fVar217 * fVar113;
        auVar179._28_4_ = 0;
        auVar29._4_4_ = fVar202 * fVar106;
        auVar29._0_4_ = fVar196 * fVar130;
        auVar29._8_4_ = fVar196 * fVar108;
        auVar29._12_4_ = fVar202 * fVar110;
        auVar29._16_4_ = fVar196 * fVar111;
        auVar29._20_4_ = fVar202 * fVar112;
        auVar29._24_4_ = fVar196 * fVar113;
        auVar29._28_4_ = fVar202;
        auVar23 = vfmadd231ps_fma(auVar159,auVar164,local_7c0);
        auVar96 = vfmadd231ps_fma(auVar179,auVar164,local_5e0);
        auVar95 = vfmadd231ps_fma(auVar29,local_140,auVar164);
        auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),auVar10,local_740);
        auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar10,local_6a0);
        auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar10,auVar218);
        auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),auVar155,local_760);
        auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar155,local_460);
        auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),local_4a0,auVar155);
        fVar130 = *(float *)(catmullrom_basis1 + lVar26 + 0x1f9c);
        fVar106 = *(float *)(catmullrom_basis1 + lVar26 + 0x1fa0);
        fVar108 = *(float *)(catmullrom_basis1 + lVar26 + 0x1fa4);
        fVar110 = *(float *)(catmullrom_basis1 + lVar26 + 0x1fa8);
        fVar111 = *(float *)(catmullrom_basis1 + lVar26 + 0x1fac);
        fVar112 = *(float *)(catmullrom_basis1 + lVar26 + 0x1fb0);
        fVar113 = *(float *)(catmullrom_basis1 + lVar26 + 0x1fb4);
        auVar10._4_4_ = local_720 * fVar106;
        auVar10._0_4_ = local_720 * fVar130;
        auVar10._8_4_ = local_720 * fVar108;
        auVar10._12_4_ = local_720 * fVar110;
        auVar10._16_4_ = local_720 * fVar111;
        auVar10._20_4_ = local_720 * fVar112;
        auVar10._24_4_ = local_720 * fVar113;
        auVar10._28_4_ = auVar155._28_4_;
        auVar164._4_4_ = fVar219 * fVar106;
        auVar164._0_4_ = fVar217 * fVar130;
        auVar164._8_4_ = fVar217 * fVar108;
        auVar164._12_4_ = fVar219 * fVar110;
        auVar164._16_4_ = fVar217 * fVar111;
        auVar164._20_4_ = fVar219 * fVar112;
        auVar164._24_4_ = fVar217 * fVar113;
        auVar164._28_4_ = fVar219;
        auVar30._4_4_ = fVar106 * fVar202;
        auVar30._0_4_ = fVar130 * fVar196;
        auVar30._8_4_ = fVar108 * fVar196;
        auVar30._12_4_ = fVar110 * fVar202;
        auVar30._16_4_ = fVar111 * fVar196;
        auVar30._20_4_ = fVar112 * fVar202;
        auVar30._24_4_ = fVar113 * fVar196;
        auVar30._28_4_ = auVar18._4_4_;
        auVar155 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar26 + 0x1b18);
        auVar18 = vfmadd231ps_fma(auVar10,auVar155,local_7c0);
        auVar132 = vfmadd231ps_fma(auVar164,auVar155,local_5e0);
        auVar115 = vfmadd231ps_fma(auVar30,auVar155,local_140);
        auVar155 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar26 + 0x1694);
        auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar155,local_740);
        auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar155,local_6a0);
        auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),auVar218,auVar155);
        auVar155 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar26 + 0x1210);
        auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar155,local_760);
        auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar155,local_460);
        auVar121._8_4_ = 0x7fffffff;
        auVar121._0_8_ = 0x7fffffff7fffffff;
        auVar121._12_4_ = 0x7fffffff;
        auVar121._16_4_ = 0x7fffffff;
        auVar121._20_4_ = 0x7fffffff;
        auVar121._24_4_ = 0x7fffffff;
        auVar121._28_4_ = 0x7fffffff;
        auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),local_4a0,auVar155);
        auVar155 = vandps_avx(ZEXT1632(auVar23),auVar121);
        auVar10 = vandps_avx(ZEXT1632(auVar96),auVar121);
        auVar10 = vmaxps_avx(auVar155,auVar10);
        auVar155 = vandps_avx(ZEXT1632(auVar95),auVar121);
        auVar155 = vmaxps_avx(auVar10,auVar155);
        auVar140._4_4_ = fVar131;
        auVar140._0_4_ = fVar131;
        auVar140._8_4_ = fVar131;
        auVar140._12_4_ = fVar131;
        auVar140._16_4_ = fVar131;
        auVar140._20_4_ = fVar131;
        auVar140._24_4_ = fVar131;
        auVar140._28_4_ = fVar131;
        auVar155 = vcmpps_avx(auVar155,auVar140,1);
        auVar164 = vblendvps_avx(ZEXT1632(auVar23),auVar24,auVar155);
        auVar124 = vblendvps_avx(ZEXT1632(auVar96),auVar25,auVar155);
        auVar155 = vandps_avx(ZEXT1632(auVar18),auVar121);
        auVar10 = vandps_avx(ZEXT1632(auVar132),auVar121);
        auVar160 = vmaxps_avx(auVar155,auVar10);
        auVar155 = vandps_avx(ZEXT1632(auVar115),auVar121);
        auVar155 = vmaxps_avx(auVar160,auVar155);
        auVar186 = vcmpps_avx(auVar155,auVar140,1);
        auVar155 = vblendvps_avx(ZEXT1632(auVar18),auVar24,auVar186);
        auVar160 = vblendvps_avx(ZEXT1632(auVar132),auVar25,auVar186);
        auVar18 = vfmadd213ps_fma(auVar98,local_4a0,ZEXT1632(auVar22));
        auVar22 = vfmadd213ps_fma(auVar164,auVar164,ZEXT832(0) << 0x20);
        auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar124,auVar124);
        auVar98 = vrsqrtps_avx(ZEXT1632(auVar22));
        fVar130 = auVar98._0_4_;
        fVar106 = auVar98._4_4_;
        fVar108 = auVar98._8_4_;
        fVar110 = auVar98._12_4_;
        fVar111 = auVar98._16_4_;
        fVar112 = auVar98._20_4_;
        fVar113 = auVar98._24_4_;
        auVar24._4_4_ = fVar106 * fVar106 * fVar106 * auVar22._4_4_ * -0.5;
        auVar24._0_4_ = fVar130 * fVar130 * fVar130 * auVar22._0_4_ * -0.5;
        auVar24._8_4_ = fVar108 * fVar108 * fVar108 * auVar22._8_4_ * -0.5;
        auVar24._12_4_ = fVar110 * fVar110 * fVar110 * auVar22._12_4_ * -0.5;
        auVar24._16_4_ = fVar111 * fVar111 * fVar111 * -0.0;
        auVar24._20_4_ = fVar112 * fVar112 * fVar112 * -0.0;
        auVar24._24_4_ = fVar113 * fVar113 * fVar113 * -0.0;
        auVar24._28_4_ = auVar10._28_4_;
        auVar208._8_4_ = 0x3fc00000;
        auVar208._0_8_ = 0x3fc000003fc00000;
        auVar208._12_4_ = 0x3fc00000;
        auVar208._16_4_ = 0x3fc00000;
        auVar208._20_4_ = 0x3fc00000;
        auVar208._24_4_ = 0x3fc00000;
        auVar208._28_4_ = 0x3fc00000;
        auVar22 = vfmadd231ps_fma(auVar24,auVar208,auVar98);
        fVar130 = auVar22._0_4_;
        fVar106 = auVar22._4_4_;
        auVar31._4_4_ = fVar106 * auVar124._4_4_;
        auVar31._0_4_ = fVar130 * auVar124._0_4_;
        fVar108 = auVar22._8_4_;
        auVar31._8_4_ = fVar108 * auVar124._8_4_;
        fVar110 = auVar22._12_4_;
        auVar31._12_4_ = fVar110 * auVar124._12_4_;
        auVar31._16_4_ = auVar124._16_4_ * 0.0;
        auVar31._20_4_ = auVar124._20_4_ * 0.0;
        auVar31._24_4_ = auVar124._24_4_ * 0.0;
        auVar31._28_4_ = 0;
        auVar32._4_4_ = fVar106 * -auVar164._4_4_;
        auVar32._0_4_ = fVar130 * -auVar164._0_4_;
        auVar32._8_4_ = fVar108 * -auVar164._8_4_;
        auVar32._12_4_ = fVar110 * -auVar164._12_4_;
        auVar32._16_4_ = -auVar164._16_4_ * 0.0;
        auVar32._20_4_ = -auVar164._20_4_ * 0.0;
        auVar32._24_4_ = -auVar164._24_4_ * 0.0;
        auVar32._28_4_ = auVar98._28_4_;
        auVar22 = vfmadd213ps_fma(auVar155,auVar155,ZEXT832(0) << 0x20);
        auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar160,auVar160);
        auVar10 = vrsqrtps_avx(ZEXT1632(auVar22));
        auVar33._28_4_ = auVar186._28_4_;
        auVar33._0_28_ =
             ZEXT1628(CONCAT412(fVar110 * 0.0,
                                CONCAT48(fVar108 * 0.0,CONCAT44(fVar106 * 0.0,fVar130 * 0.0))));
        fVar130 = auVar10._0_4_;
        fVar106 = auVar10._4_4_;
        fVar108 = auVar10._8_4_;
        fVar110 = auVar10._12_4_;
        fVar111 = auVar10._16_4_;
        fVar112 = auVar10._20_4_;
        fVar113 = auVar10._24_4_;
        auVar34._4_4_ = fVar106 * fVar106 * fVar106 * auVar22._4_4_ * -0.5;
        auVar34._0_4_ = fVar130 * fVar130 * fVar130 * auVar22._0_4_ * -0.5;
        auVar34._8_4_ = fVar108 * fVar108 * fVar108 * auVar22._8_4_ * -0.5;
        auVar34._12_4_ = fVar110 * fVar110 * fVar110 * auVar22._12_4_ * -0.5;
        auVar34._16_4_ = fVar111 * fVar111 * fVar111 * -0.0;
        auVar34._20_4_ = fVar112 * fVar112 * fVar112 * -0.0;
        auVar34._24_4_ = fVar113 * fVar113 * fVar113 * -0.0;
        auVar34._28_4_ = 0;
        auVar22 = vfmadd231ps_fma(auVar34,auVar208,auVar10);
        fVar130 = auVar22._0_4_;
        auVar190._0_4_ = auVar160._0_4_ * fVar130;
        fVar106 = auVar22._4_4_;
        auVar190._4_4_ = auVar160._4_4_ * fVar106;
        fVar108 = auVar22._8_4_;
        auVar190._8_4_ = auVar160._8_4_ * fVar108;
        fVar110 = auVar22._12_4_;
        auVar190._12_4_ = auVar160._12_4_ * fVar110;
        auVar190._16_4_ = auVar160._16_4_ * 0.0;
        auVar190._20_4_ = auVar160._20_4_ * 0.0;
        auVar190._24_4_ = auVar160._24_4_ * 0.0;
        auVar190._28_4_ = 0;
        auVar35._4_4_ = -auVar155._4_4_ * fVar106;
        auVar35._0_4_ = -auVar155._0_4_ * fVar130;
        auVar35._8_4_ = -auVar155._8_4_ * fVar108;
        auVar35._12_4_ = -auVar155._12_4_ * fVar110;
        auVar35._16_4_ = -auVar155._16_4_ * 0.0;
        auVar35._20_4_ = -auVar155._20_4_ * 0.0;
        auVar35._24_4_ = -auVar155._24_4_ * 0.0;
        auVar35._28_4_ = auVar160._28_4_;
        auVar36._28_4_ = auVar10._28_4_;
        auVar36._0_28_ =
             ZEXT1628(CONCAT412(fVar110 * 0.0,
                                CONCAT48(fVar108 * 0.0,CONCAT44(fVar106 * 0.0,fVar130 * 0.0))));
        auVar22 = vfmadd213ps_fma(auVar31,ZEXT1632(auVar20),auVar168);
        auVar155 = ZEXT1632(auVar20);
        auVar23 = vfmadd213ps_fma(auVar32,auVar155,auVar99);
        auVar96 = vfmadd213ps_fma(auVar33,auVar155,ZEXT1632(auVar18));
        auVar115 = vfnmadd213ps_fma(auVar31,auVar155,auVar168);
        auVar95 = vfmadd213ps_fma(auVar190,ZEXT1632(auVar21),auVar119);
        auVar94 = vfnmadd213ps_fma(auVar32,auVar155,auVar99);
        auVar155 = ZEXT1632(auVar21);
        auVar132 = vfmadd213ps_fma(auVar35,auVar155,auVar139);
        local_600 = ZEXT1632(auVar20);
        auVar148 = vfnmadd231ps_fma(ZEXT1632(auVar18),local_600,auVar33);
        auVar18 = vfmadd213ps_fma(auVar36,auVar155,ZEXT1632(auVar17));
        auVar116 = vfnmadd213ps_fma(auVar190,auVar155,auVar119);
        auVar144 = vfnmadd213ps_fma(auVar35,auVar155,auVar139);
        auVar93 = vfnmadd231ps_fma(ZEXT1632(auVar17),ZEXT1632(auVar21),auVar36);
        auVar155 = vsubps_avx(ZEXT1632(auVar132),ZEXT1632(auVar94));
        auVar10 = vsubps_avx(ZEXT1632(auVar18),ZEXT1632(auVar148));
        auVar99._4_4_ = auVar148._4_4_ * auVar155._4_4_;
        auVar99._0_4_ = auVar148._0_4_ * auVar155._0_4_;
        auVar99._8_4_ = auVar148._8_4_ * auVar155._8_4_;
        auVar99._12_4_ = auVar148._12_4_ * auVar155._12_4_;
        auVar99._16_4_ = auVar155._16_4_ * 0.0;
        auVar99._20_4_ = auVar155._20_4_ * 0.0;
        auVar99._24_4_ = auVar155._24_4_ * 0.0;
        auVar99._28_4_ = 0;
        auVar20 = vfmsub231ps_fma(auVar99,ZEXT1632(auVar94),auVar10);
        auVar119._4_4_ = auVar10._4_4_ * auVar115._4_4_;
        auVar119._0_4_ = auVar10._0_4_ * auVar115._0_4_;
        auVar119._8_4_ = auVar10._8_4_ * auVar115._8_4_;
        auVar119._12_4_ = auVar10._12_4_ * auVar115._12_4_;
        auVar119._16_4_ = auVar10._16_4_ * 0.0;
        auVar119._20_4_ = auVar10._20_4_ * 0.0;
        auVar119._24_4_ = auVar10._24_4_ * 0.0;
        auVar119._28_4_ = auVar10._28_4_;
        auVar10 = vsubps_avx(ZEXT1632(auVar95),ZEXT1632(auVar115));
        auVar17 = vfmsub231ps_fma(auVar119,ZEXT1632(auVar148),auVar10);
        auVar139._4_4_ = auVar94._4_4_ * auVar10._4_4_;
        auVar139._0_4_ = auVar94._0_4_ * auVar10._0_4_;
        auVar139._8_4_ = auVar94._8_4_ * auVar10._8_4_;
        auVar139._12_4_ = auVar94._12_4_ * auVar10._12_4_;
        auVar139._16_4_ = auVar10._16_4_ * 0.0;
        auVar139._20_4_ = auVar10._20_4_ * 0.0;
        auVar139._24_4_ = auVar10._24_4_ * 0.0;
        auVar139._28_4_ = auVar10._28_4_;
        auVar160 = ZEXT1632(auVar115);
        auVar115 = vfmsub231ps_fma(auVar139,auVar160,auVar155);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar115),ZEXT832(0) << 0x20,ZEXT1632(auVar17));
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),ZEXT832(0) << 0x20,ZEXT1632(auVar20));
        auVar100 = vcmpps_avx(ZEXT1632(auVar17),ZEXT832(0) << 0x20,2);
        auVar155 = vblendvps_avx(ZEXT1632(auVar116),ZEXT1632(auVar22),auVar100);
        auVar10 = vblendvps_avx(ZEXT1632(auVar144),ZEXT1632(auVar23),auVar100);
        local_6e0 = vblendvps_avx(ZEXT1632(auVar93),ZEXT1632(auVar96),auVar100);
        auVar164 = vblendvps_avx(auVar160,ZEXT1632(auVar95),auVar100);
        auVar98 = vblendvps_avx(ZEXT1632(auVar94),ZEXT1632(auVar132),auVar100);
        auVar124 = vblendvps_avx(ZEXT1632(auVar148),ZEXT1632(auVar18),auVar100);
        auVar160 = vblendvps_avx(ZEXT1632(auVar95),auVar160,auVar100);
        auVar186 = vblendvps_avx(ZEXT1632(auVar132),ZEXT1632(auVar94),auVar100);
        auVar17 = vpackssdw_avx(auVar19._0_16_,auVar19._16_16_);
        auVar24 = vblendvps_avx(ZEXT1632(auVar18),ZEXT1632(auVar148),auVar100);
        auVar126 = vsubps_avx(auVar160,auVar155);
        auVar127 = vsubps_avx(auVar186,auVar10);
        auVar142 = vsubps_avx(auVar24,local_6e0);
        auVar99 = vsubps_avx(auVar155,auVar164);
        auVar119 = vsubps_avx(auVar10,auVar98);
        auVar120 = vsubps_avx(local_6e0,auVar124);
        auVar168._4_4_ = auVar142._4_4_ * auVar155._4_4_;
        auVar168._0_4_ = auVar142._0_4_ * auVar155._0_4_;
        auVar168._8_4_ = auVar142._8_4_ * auVar155._8_4_;
        auVar168._12_4_ = auVar142._12_4_ * auVar155._12_4_;
        auVar168._16_4_ = auVar142._16_4_ * auVar155._16_4_;
        auVar168._20_4_ = auVar142._20_4_ * auVar155._20_4_;
        auVar168._24_4_ = auVar142._24_4_ * auVar155._24_4_;
        auVar168._28_4_ = auVar24._28_4_;
        auVar18 = vfmsub231ps_fma(auVar168,local_6e0,auVar126);
        auVar37._4_4_ = auVar126._4_4_ * auVar10._4_4_;
        auVar37._0_4_ = auVar126._0_4_ * auVar10._0_4_;
        auVar37._8_4_ = auVar126._8_4_ * auVar10._8_4_;
        auVar37._12_4_ = auVar126._12_4_ * auVar10._12_4_;
        auVar37._16_4_ = auVar126._16_4_ * auVar10._16_4_;
        auVar37._20_4_ = auVar126._20_4_ * auVar10._20_4_;
        auVar37._24_4_ = auVar126._24_4_ * auVar10._24_4_;
        auVar37._28_4_ = auVar160._28_4_;
        auVar20 = vfmsub231ps_fma(auVar37,auVar155,auVar127);
        auVar18 = vfmadd231ps_fma(ZEXT1632(auVar20),ZEXT832(0) << 0x20,ZEXT1632(auVar18));
        auVar102._0_4_ = auVar127._0_4_ * local_6e0._0_4_;
        auVar102._4_4_ = auVar127._4_4_ * local_6e0._4_4_;
        auVar102._8_4_ = auVar127._8_4_ * local_6e0._8_4_;
        auVar102._12_4_ = auVar127._12_4_ * local_6e0._12_4_;
        auVar102._16_4_ = auVar127._16_4_ * local_6e0._16_4_;
        auVar102._20_4_ = auVar127._20_4_ * local_6e0._20_4_;
        auVar102._24_4_ = auVar127._24_4_ * local_6e0._24_4_;
        auVar102._28_4_ = 0;
        auVar20 = vfmsub231ps_fma(auVar102,auVar10,auVar142);
        auVar20 = vfmadd231ps_fma(ZEXT1632(auVar18),ZEXT832(0) << 0x20,ZEXT1632(auVar20));
        auVar103._0_4_ = auVar120._0_4_ * auVar164._0_4_;
        auVar103._4_4_ = auVar120._4_4_ * auVar164._4_4_;
        auVar103._8_4_ = auVar120._8_4_ * auVar164._8_4_;
        auVar103._12_4_ = auVar120._12_4_ * auVar164._12_4_;
        auVar103._16_4_ = auVar120._16_4_ * auVar164._16_4_;
        auVar103._20_4_ = auVar120._20_4_ * auVar164._20_4_;
        auVar103._24_4_ = auVar120._24_4_ * auVar164._24_4_;
        auVar103._28_4_ = 0;
        auVar18 = vfmsub231ps_fma(auVar103,auVar99,auVar124);
        auVar38._4_4_ = auVar119._4_4_ * auVar124._4_4_;
        auVar38._0_4_ = auVar119._0_4_ * auVar124._0_4_;
        auVar38._8_4_ = auVar119._8_4_ * auVar124._8_4_;
        auVar38._12_4_ = auVar119._12_4_ * auVar124._12_4_;
        auVar38._16_4_ = auVar119._16_4_ * auVar124._16_4_;
        auVar38._20_4_ = auVar119._20_4_ * auVar124._20_4_;
        auVar38._24_4_ = auVar119._24_4_ * auVar124._24_4_;
        auVar38._28_4_ = auVar124._28_4_;
        auVar22 = vfmsub231ps_fma(auVar38,auVar98,auVar120);
        auVar39._4_4_ = auVar99._4_4_ * auVar98._4_4_;
        auVar39._0_4_ = auVar99._0_4_ * auVar98._0_4_;
        auVar39._8_4_ = auVar99._8_4_ * auVar98._8_4_;
        auVar39._12_4_ = auVar99._12_4_ * auVar98._12_4_;
        auVar39._16_4_ = auVar99._16_4_ * auVar98._16_4_;
        auVar39._20_4_ = auVar99._20_4_ * auVar98._20_4_;
        auVar39._24_4_ = auVar99._24_4_ * auVar98._24_4_;
        auVar39._28_4_ = auVar186._28_4_;
        auVar23 = vfmsub231ps_fma(auVar39,auVar119,auVar164);
        auVar18 = vfmadd231ps_fma(ZEXT1632(auVar23),ZEXT832(0) << 0x20,ZEXT1632(auVar18));
        auVar22 = vfmadd231ps_fma(ZEXT1632(auVar18),ZEXT832(0) << 0x20,ZEXT1632(auVar22));
        auVar164 = vmaxps_avx(ZEXT1632(auVar20),ZEXT1632(auVar22));
        auVar164 = vcmpps_avx(auVar164,ZEXT832(0) << 0x20,2);
        auVar18 = vpackssdw_avx(auVar164._0_16_,auVar164._16_16_);
        auVar17 = vpand_avx(auVar18,auVar17);
        auVar164 = vpmovsxwd_avx2(auVar17);
        if ((((((((auVar164 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar164 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar164 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar164 >> 0x7f,0) == '\0') &&
              (auVar164 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar164 >> 0xbf,0) == '\0') &&
            (auVar164 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar164[0x1f]) {
LAB_016cc3f8:
          auVar165 = ZEXT3264(CONCAT824(uStack_4a8,
                                        CONCAT816(uStack_4b0,CONCAT88(uStack_4b8,local_4c0))));
        }
        else {
          auVar40._4_4_ = auVar127._4_4_ * auVar120._4_4_;
          auVar40._0_4_ = auVar127._0_4_ * auVar120._0_4_;
          auVar40._8_4_ = auVar127._8_4_ * auVar120._8_4_;
          auVar40._12_4_ = auVar127._12_4_ * auVar120._12_4_;
          auVar40._16_4_ = auVar127._16_4_ * auVar120._16_4_;
          auVar40._20_4_ = auVar127._20_4_ * auVar120._20_4_;
          auVar40._24_4_ = auVar127._24_4_ * auVar120._24_4_;
          auVar40._28_4_ = auVar164._28_4_;
          auVar95 = vfmsub231ps_fma(auVar40,auVar119,auVar142);
          auVar122._0_4_ = auVar142._0_4_ * auVar99._0_4_;
          auVar122._4_4_ = auVar142._4_4_ * auVar99._4_4_;
          auVar122._8_4_ = auVar142._8_4_ * auVar99._8_4_;
          auVar122._12_4_ = auVar142._12_4_ * auVar99._12_4_;
          auVar122._16_4_ = auVar142._16_4_ * auVar99._16_4_;
          auVar122._20_4_ = auVar142._20_4_ * auVar99._20_4_;
          auVar122._24_4_ = auVar142._24_4_ * auVar99._24_4_;
          auVar122._28_4_ = 0;
          auVar96 = vfmsub231ps_fma(auVar122,auVar126,auVar120);
          auVar41._4_4_ = auVar126._4_4_ * auVar119._4_4_;
          auVar41._0_4_ = auVar126._0_4_ * auVar119._0_4_;
          auVar41._8_4_ = auVar126._8_4_ * auVar119._8_4_;
          auVar41._12_4_ = auVar126._12_4_ * auVar119._12_4_;
          auVar41._16_4_ = auVar126._16_4_ * auVar119._16_4_;
          auVar41._20_4_ = auVar126._20_4_ * auVar119._20_4_;
          auVar41._24_4_ = auVar126._24_4_ * auVar119._24_4_;
          auVar41._28_4_ = auVar98._28_4_;
          auVar132 = vfmsub231ps_fma(auVar41,auVar99,auVar127);
          auVar18 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar96),ZEXT1632(auVar132));
          auVar23 = vfmadd231ps_fma(ZEXT1632(auVar18),ZEXT1632(auVar95),_DAT_02020f00);
          auVar164 = vrcpps_avx(ZEXT1632(auVar23));
          auVar191._8_4_ = 0x3f800000;
          auVar191._0_8_ = &DAT_3f8000003f800000;
          auVar191._12_4_ = 0x3f800000;
          auVar191._16_4_ = 0x3f800000;
          auVar191._20_4_ = 0x3f800000;
          auVar191._24_4_ = 0x3f800000;
          auVar191._28_4_ = 0x3f800000;
          auVar18 = vfnmadd213ps_fma(auVar164,ZEXT1632(auVar23),auVar191);
          auVar18 = vfmadd132ps_fma(ZEXT1632(auVar18),auVar164,auVar164);
          auVar170._0_4_ = auVar132._0_4_ * local_6e0._0_4_;
          auVar170._4_4_ = auVar132._4_4_ * local_6e0._4_4_;
          auVar170._8_4_ = auVar132._8_4_ * local_6e0._8_4_;
          auVar170._12_4_ = auVar132._12_4_ * local_6e0._12_4_;
          auVar170._16_4_ = local_6e0._16_4_ * 0.0;
          auVar170._20_4_ = local_6e0._20_4_ * 0.0;
          auVar170._24_4_ = local_6e0._24_4_ * 0.0;
          auVar170._28_4_ = 0;
          auVar96 = vfmadd231ps_fma(auVar170,auVar10,ZEXT1632(auVar96));
          auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),ZEXT1632(auVar95),auVar155);
          fVar130 = auVar18._0_4_;
          fVar106 = auVar18._4_4_;
          fVar108 = auVar18._8_4_;
          fVar110 = auVar18._12_4_;
          auVar164 = ZEXT1632(CONCAT412(fVar110 * auVar96._12_4_,
                                        CONCAT48(fVar108 * auVar96._8_4_,
                                                 CONCAT44(fVar106 * auVar96._4_4_,
                                                          fVar130 * auVar96._0_4_))));
          auVar104._4_4_ = uVar84;
          auVar104._0_4_ = uVar84;
          auVar104._8_4_ = uVar84;
          auVar104._12_4_ = uVar84;
          auVar104._16_4_ = uVar84;
          auVar104._20_4_ = uVar84;
          auVar104._24_4_ = uVar84;
          auVar104._28_4_ = uVar84;
          uVar91 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar123._4_4_ = uVar91;
          auVar123._0_4_ = uVar91;
          auVar123._8_4_ = uVar91;
          auVar123._12_4_ = uVar91;
          auVar123._16_4_ = uVar91;
          auVar123._20_4_ = uVar91;
          auVar123._24_4_ = uVar91;
          auVar123._28_4_ = uVar91;
          auVar155 = vcmpps_avx(auVar104,auVar164,2);
          auVar10 = vcmpps_avx(auVar164,auVar123,2);
          auVar155 = vandps_avx(auVar10,auVar155);
          auVar18 = vpackssdw_avx(auVar155._0_16_,auVar155._16_16_);
          auVar17 = vpand_avx(auVar17,auVar18);
          auVar155 = vpmovsxwd_avx2(auVar17);
          if ((((((((auVar155 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar155 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar155 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar155 >> 0x7f,0) == '\0') &&
                (auVar155 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar155 >> 0xbf,0) == '\0') &&
              (auVar155 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar155[0x1f]) goto LAB_016cc3f8;
          auVar155 = vcmpps_avx(ZEXT1632(auVar23),ZEXT832(0) << 0x20,4);
          auVar18 = vpackssdw_avx(auVar155._0_16_,auVar155._16_16_);
          auVar17 = vpand_avx(auVar17,auVar18);
          auVar155 = vpmovsxwd_avx2(auVar17);
          auVar165 = ZEXT3264(CONCAT824(uStack_4a8,
                                        CONCAT816(uStack_4b0,CONCAT88(uStack_4b8,local_4c0))));
          if ((((((((auVar155 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar155 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar155 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar155 >> 0x7f,0) != '\0') ||
                (auVar155 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar155 >> 0xbf,0) != '\0') ||
              (auVar155 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar155[0x1f] < '\0') {
            auVar98 = ZEXT1632(CONCAT412(fVar110 * auVar20._12_4_,
                                         CONCAT48(fVar108 * auVar20._8_4_,
                                                  CONCAT44(fVar106 * auVar20._4_4_,
                                                           fVar130 * auVar20._0_4_))));
            auVar124 = ZEXT1632(CONCAT412(fVar110 * auVar22._12_4_,
                                          CONCAT48(fVar108 * auVar22._8_4_,
                                                   CONCAT44(fVar106 * auVar22._4_4_,
                                                            fVar130 * auVar22._0_4_))));
            auVar154._8_4_ = 0x3f800000;
            auVar154._0_8_ = &DAT_3f8000003f800000;
            auVar154._12_4_ = 0x3f800000;
            auVar154._16_4_ = 0x3f800000;
            auVar154._20_4_ = 0x3f800000;
            auVar154._24_4_ = 0x3f800000;
            auVar154._28_4_ = 0x3f800000;
            auVar10 = vsubps_avx(auVar154,auVar98);
            _local_160 = vblendvps_avx(auVar10,auVar98,auVar100);
            auVar10 = vsubps_avx(auVar154,auVar124);
            local_340 = vblendvps_avx(auVar10,auVar124,auVar100);
            auVar165 = ZEXT3264(auVar155);
            local_780 = auVar164;
          }
        }
        auVar210 = ZEXT3264(local_740);
        auVar192 = ZEXT3264(local_760);
        auVar155 = auVar165._0_32_;
        if ((((((((auVar155 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar155 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar155 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar155 >> 0x7f,0) != '\0') ||
              (auVar165 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
             SUB321(auVar155 >> 0xbf,0) != '\0') ||
            (auVar165 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
            auVar165[0x1f] < '\0') {
          auVar10 = vsubps_avx(ZEXT1632(auVar21),local_600);
          auVar17 = vfmadd213ps_fma(auVar10,_local_160,local_600);
          fVar130 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
          auVar42._4_4_ = (auVar17._4_4_ + auVar17._4_4_) * fVar130;
          auVar42._0_4_ = (auVar17._0_4_ + auVar17._0_4_) * fVar130;
          auVar42._8_4_ = (auVar17._8_4_ + auVar17._8_4_) * fVar130;
          auVar42._12_4_ = (auVar17._12_4_ + auVar17._12_4_) * fVar130;
          auVar42._16_4_ = fVar130 * 0.0;
          auVar42._20_4_ = fVar130 * 0.0;
          auVar42._24_4_ = fVar130 * 0.0;
          auVar42._28_4_ = 0;
          auVar165 = ZEXT3264(local_780);
          auVar10 = vcmpps_avx(local_780,auVar42,6);
          auVar164 = auVar155 & auVar10;
          auVar129 = ZEXT3264(auVar218);
          auVar181 = ZEXT3264(local_7c0);
          if ((((((((auVar164 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar164 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar164 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar164 >> 0x7f,0) != '\0') ||
                (auVar164 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar164 >> 0xbf,0) != '\0') ||
              (auVar164 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar164[0x1f] < '\0') {
            local_220 = vandps_avx(auVar10,auVar155);
            auVar125._8_4_ = 0xbf800000;
            auVar125._0_8_ = 0xbf800000bf800000;
            auVar125._12_4_ = 0xbf800000;
            auVar125._16_4_ = 0xbf800000;
            auVar125._20_4_ = 0xbf800000;
            auVar125._24_4_ = 0xbf800000;
            auVar125._28_4_ = 0xbf800000;
            auVar141._8_4_ = 0x40000000;
            auVar141._0_8_ = 0x4000000040000000;
            auVar141._12_4_ = 0x40000000;
            auVar141._16_4_ = 0x40000000;
            auVar141._20_4_ = 0x40000000;
            auVar141._24_4_ = 0x40000000;
            auVar141._28_4_ = 0x40000000;
            auVar17 = vfmadd213ps_fma(local_340,auVar141,auVar125);
            local_2e0 = _local_160;
            local_2c0 = ZEXT1632(auVar17);
            local_280 = 0;
            auVar200 = ZEXT3264(_local_560);
            local_340 = local_2c0;
            if ((pGVar14->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              uVar88 = 0;
              auVar187 = ZEXT3264(local_5e0);
            }
            else {
              auVar187 = ZEXT3264(local_5e0);
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (uVar88 = CONCAT71((int7)(uVar88 >> 8),1),
                 pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                fVar130 = 1.0 / auVar101._0_4_;
                local_200[0] = fVar130 * ((float)local_160._0_4_ + 0.0);
                local_200[1] = fVar130 * ((float)local_160._4_4_ + 1.0);
                local_200[2] = fVar130 * (fStack_158 + 2.0);
                local_200[3] = fVar130 * (fStack_154 + 3.0);
                fStack_1f0 = fVar130 * (fStack_150 + 4.0);
                fStack_1ec = fVar130 * (fStack_14c + 5.0);
                fStack_1e8 = fVar130 * (fStack_148 + 6.0);
                fStack_1e4 = fStack_144 + 7.0;
                local_340._0_8_ = auVar17._0_8_;
                local_340._8_8_ = auVar17._8_8_;
                local_1e0 = local_340._0_8_;
                uStack_1d8 = local_340._8_8_;
                uStack_1d0 = 0;
                uStack_1c8 = 0;
                local_1c0 = local_780;
                uVar84 = vmovmskps_avx(local_220);
                uVar88 = CONCAT71((int7)(uVar88 >> 8),uVar84 != 0);
                if (uVar84 != 0) {
                  uVar85 = 0;
                  uVar86 = (ulong)(uVar84 & 0xff);
                  for (uVar87 = uVar86; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x8000000000000000
                      ) {
                    uVar85 = uVar85 + 1;
                  }
                  local_5c0._0_16_ = CONCAT412(uVar83,CONCAT48(uVar83,CONCAT44(uVar83,uVar83)));
                  local_5c0 = ZEXT1632(local_5c0._0_16_);
                  local_500._0_8_ = CONCAT44(uVar12,uVar12);
                  local_500._0_16_ = CONCAT412(uVar12,CONCAT48(uVar12,local_500._0_8_));
                  local_500 = ZEXT1632(local_500._0_16_);
                  _local_520 = ZEXT1632(*pauVar2);
                  _auStack_530 = auVar25._16_16_;
                  _local_540 = *pauVar3;
                  _local_620 = ZEXT1632(*pauVar4);
                  _auStack_470 = auVar19._16_16_;
                  _local_480 = *local_658;
                  local_6c0 = auVar218;
                  local_2a0 = local_780;
                  local_27c = iVar13;
                  local_270 = local_6f0;
                  uStack_268 = uStack_6e8;
                  local_260 = local_570;
                  uStack_258 = uStack_568;
                  local_250 = local_580;
                  uStack_248 = uStack_578;
                  local_240 = local_590;
                  uStack_238 = uStack_588;
                  do {
                    local_6e0._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                    fVar105 = local_200[uVar85];
                    local_3c0._4_4_ = fVar105;
                    local_3c0._0_4_ = fVar105;
                    local_3c0._8_4_ = fVar105;
                    local_3c0._12_4_ = fVar105;
                    local_3b0 = *(undefined4 *)((long)&local_1e0 + uVar85 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1c0 + uVar85 * 4);
                    fVar107 = 1.0 - fVar105;
                    auVar17 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_3c0,
                                              ZEXT416(0xc0a00000));
                    auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar105 * fVar105 * 3.0)),
                                              ZEXT416((uint)(fVar105 + fVar105)),auVar17);
                    auVar17 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_3c0,
                                              ZEXT416(0x40000000));
                    auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar107 * fVar107 * -3.0)),
                                              ZEXT416((uint)(fVar107 + fVar107)),auVar17);
                    auVar21 = vfnmadd231ss_fma(ZEXT416((uint)(fVar105 * (fVar107 + fVar107))),
                                               ZEXT416((uint)fVar107),ZEXT416((uint)fVar107));
                    auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar105 * fVar105)),local_3c0,
                                              ZEXT416((uint)(fVar107 * -2.0)));
                    fVar105 = auVar17._0_4_ * 0.5;
                    fVar107 = auVar20._0_4_ * 0.5;
                    auVar150._0_4_ = fVar107 * (float)local_620._0_4_;
                    auVar150._4_4_ = fVar107 * (float)local_620._4_4_;
                    auVar150._8_4_ = fVar107 * (float)uStack_618;
                    auVar150._12_4_ = fVar107 * uStack_618._4_4_;
                    auVar133._4_4_ = fVar105;
                    auVar133._0_4_ = fVar105;
                    auVar133._8_4_ = fVar105;
                    auVar133._12_4_ = fVar105;
                    auVar17 = vfmadd132ps_fma(auVar133,auVar150,_local_540);
                    fVar105 = auVar18._0_4_ * 0.5;
                    auVar151._4_4_ = fVar105;
                    auVar151._0_4_ = fVar105;
                    auVar151._8_4_ = fVar105;
                    auVar151._12_4_ = fVar105;
                    auVar17 = vfmadd132ps_fma(auVar151,auVar17,_local_520);
                    local_650.context = context->user;
                    fVar105 = auVar21._0_4_ * 0.5;
                    auVar134._4_4_ = fVar105;
                    auVar134._0_4_ = fVar105;
                    auVar134._8_4_ = fVar105;
                    auVar134._12_4_ = fVar105;
                    auVar77._8_8_ = uStack_6e8;
                    auVar77._0_8_ = local_6f0;
                    auVar17 = vfmadd132ps_fma(auVar134,auVar17,auVar77);
                    local_3f0 = auVar17._0_4_;
                    local_3e0 = vshufps_avx(auVar17,auVar17,0x55);
                    local_3d0 = vshufps_avx(auVar17,auVar17,0xaa);
                    local_3a0 = local_500._0_8_;
                    uStack_398 = local_500._8_8_;
                    local_390 = local_5c0._0_16_;
                    vpcmpeqd_avx2(ZEXT1632(local_5c0._0_16_),ZEXT1632(local_5c0._0_16_));
                    uStack_37c = (local_650.context)->instID[0];
                    local_380 = uStack_37c;
                    uStack_378 = uStack_37c;
                    uStack_374 = uStack_37c;
                    uStack_370 = (local_650.context)->instPrimID[0];
                    uStack_36c = uStack_370;
                    uStack_368 = uStack_370;
                    uStack_364 = uStack_370;
                    local_7e0 = local_480;
                    uStack_7d8 = uStack_478;
                    local_650.valid = (int *)&local_7e0;
                    local_650.geometryUserPtr = pGVar14->userPtr;
                    local_650.hit = (RTCHitN *)&local_3f0;
                    local_650.N = 4;
                    local_600._0_4_ = (int)uVar88;
                    auVar155 = auVar165._0_32_;
                    local_650.ray = (RTCRayN *)ray;
                    uStack_3ec = local_3f0;
                    uStack_3e8 = local_3f0;
                    uStack_3e4 = local_3f0;
                    uStack_3ac = local_3b0;
                    uStack_3a8 = local_3b0;
                    uStack_3a4 = local_3b0;
                    if (pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar14->occlusionFilterN)(&local_650);
                      uVar88 = (ulong)(uint)local_600._0_4_;
                      auVar200 = ZEXT3264(_local_560);
                      auVar129 = ZEXT3264(local_6c0);
                      auVar192 = ZEXT3264(local_760);
                      auVar210 = ZEXT3264(local_740);
                      auVar187 = ZEXT3264(local_5e0);
                      auVar181 = ZEXT3264(local_7c0);
                      auVar155 = local_780;
                    }
                    auVar165 = ZEXT3264(auVar155);
                    auVar73._8_8_ = uStack_7d8;
                    auVar73._0_8_ = local_7e0;
                    if (auVar73 == (undefined1  [16])0x0) {
                      auVar17 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                      auVar17 = auVar17 ^ _DAT_01febe20;
                      fVar217 = (float)local_680;
                      fVar219 = local_680._4_4_;
                      fVar105 = (float)uStack_678;
                      fVar107 = uStack_678._4_4_;
                      fVar109 = (float)uStack_670;
                      fVar172 = uStack_670._4_4_;
                      fVar173 = (float)uStack_668;
                    }
                    else {
                      p_Var16 = context->args->filter;
                      if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar14->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var16)(&local_650);
                        uVar88 = (ulong)(uint)local_600._0_4_;
                        auVar200 = ZEXT3264(_local_560);
                        auVar129 = ZEXT3264(local_6c0);
                        auVar192 = ZEXT3264(local_760);
                        auVar210 = ZEXT3264(local_740);
                        auVar187 = ZEXT3264(local_5e0);
                        auVar181 = ZEXT3264(local_7c0);
                        auVar165 = ZEXT3264(local_780);
                      }
                      auVar74._8_8_ = uStack_7d8;
                      auVar74._0_8_ = local_7e0;
                      auVar18 = vpcmpeqd_avx((undefined1  [16])0x0,auVar74);
                      auVar17 = auVar18 ^ _DAT_01febe20;
                      auVar135._8_4_ = 0xff800000;
                      auVar135._0_8_ = 0xff800000ff800000;
                      auVar135._12_4_ = 0xff800000;
                      auVar18 = vblendvps_avx(auVar135,*(undefined1 (*) [16])(local_650.ray + 0x80),
                                              auVar18);
                      *(undefined1 (*) [16])(local_650.ray + 0x80) = auVar18;
                      fVar217 = (float)local_680;
                      fVar219 = local_680._4_4_;
                      fVar105 = (float)uStack_678;
                      fVar107 = uStack_678._4_4_;
                      fVar109 = (float)uStack_670;
                      fVar172 = uStack_670._4_4_;
                      fVar173 = (float)uStack_668;
                    }
                    auVar218 = auVar129._0_32_;
                    auVar117._8_8_ = 0x100000001;
                    auVar117._0_8_ = 0x100000001;
                    if ((auVar117 & auVar17) != (undefined1  [16])0x0) break;
                    *(undefined4 *)(ray + k * 4 + 0x80) = local_6e0._0_4_;
                    uVar87 = uVar85 & 0x3f;
                    uVar85 = 0;
                    uVar86 = uVar86 ^ 1L << uVar87;
                    for (uVar87 = uVar86; (uVar87 & 1) == 0;
                        uVar87 = uVar87 >> 1 | 0x8000000000000000) {
                      uVar85 = uVar85 + 1;
                    }
                    uVar88 = CONCAT71((int7)(uVar88 >> 8),uVar86 != 0);
                  } while (uVar86 != 0);
                }
                uVar88 = uVar88 & 0xffffffffffffff01;
              }
            }
            auVar129 = ZEXT3264(local_6a0);
            goto LAB_016caed7;
          }
        }
        auVar165 = ZEXT3264(local_780);
        uVar88 = 0;
        auVar187 = ZEXT3264(local_5e0);
        auVar181 = ZEXT3264(local_7c0);
        auVar129 = ZEXT3264(local_6a0);
        auVar200 = ZEXT3264(_local_560);
      }
LAB_016caed7:
      auVar204 = ZEXT464((uint)fVar131);
      if (8 < iVar13) {
        local_540._4_4_ = iVar13;
        local_540._0_4_ = iVar13;
        fStack_538 = (float)iVar13;
        fStack_534 = (float)iVar13;
        auStack_530._0_4_ = iVar13;
        auStack_530._4_4_ = iVar13;
        fStack_528 = (float)iVar13;
        iStack_524 = iVar13;
        local_480._4_4_ = fVar131;
        local_480._0_4_ = fVar131;
        uStack_478._0_4_ = fVar131;
        uStack_478._4_4_ = fVar131;
        auStack_470._0_4_ = fVar131;
        auStack_470._4_4_ = fVar131;
        fStack_468 = fVar131;
        fStack_464 = fVar131;
        local_100 = local_7a0._0_4_;
        uStack_fc = local_7a0._0_4_;
        uStack_f8 = local_7a0._0_4_;
        uStack_f4 = local_7a0._0_4_;
        uStack_f0 = local_7a0._0_4_;
        uStack_ec = local_7a0._0_4_;
        uStack_e8 = local_7a0._0_4_;
        uStack_e4 = local_7a0._0_4_;
        local_120 = 1.0 / (float)local_420._0_4_;
        fStack_11c = local_120;
        fStack_118 = local_120;
        fStack_114 = local_120;
        fStack_110 = local_120;
        fStack_10c = local_120;
        fStack_108 = local_120;
        fStack_104 = local_120;
        local_310 = (undefined4)local_7c8;
        uStack_30c = (undefined4)local_7c8;
        uStack_308 = (undefined4)local_7c8;
        uStack_304 = (undefined4)local_7c8;
        local_320 = local_440._0_4_;
        uStack_31c = local_440._0_4_;
        uStack_318 = local_440._0_4_;
        uStack_314 = local_440._0_4_;
        lVar89 = 8;
        local_780 = auVar165._0_32_;
        _local_560 = auVar200._0_32_;
        local_6c0 = auVar218;
        do {
          auVar155 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar89 * 4 + lVar26);
          auVar10 = *(undefined1 (*) [32])(lVar26 + 0x22307f0 + lVar89 * 4);
          auVar164 = *(undefined1 (*) [32])(lVar26 + 0x2230c74 + lVar89 * 4);
          pauVar5 = (undefined1 (*) [32])(lVar26 + 0x22310f8 + lVar89 * 4);
          auVar80 = *(undefined1 (*) [28])*pauVar5;
          auVar201._0_4_ = local_720 * *(float *)*pauVar5;
          auVar201._4_4_ = fStack_71c * *(float *)(*pauVar5 + 4);
          auVar201._8_4_ = fStack_718 * *(float *)(*pauVar5 + 8);
          auVar201._12_4_ = fStack_714 * *(float *)(*pauVar5 + 0xc);
          auVar201._16_4_ = fStack_710 * *(float *)(*pauVar5 + 0x10);
          auVar201._20_4_ = fStack_70c * *(float *)(*pauVar5 + 0x14);
          auVar201._28_36_ = auVar200._28_36_;
          auVar201._24_4_ = fStack_708 * *(float *)(*pauVar5 + 0x18);
          auVar200._0_4_ = fVar217 * *(float *)*pauVar5;
          auVar200._4_4_ = fVar219 * *(float *)(*pauVar5 + 4);
          auVar200._8_4_ = fVar105 * *(float *)(*pauVar5 + 8);
          auVar200._12_4_ = fVar107 * *(float *)(*pauVar5 + 0xc);
          auVar200._16_4_ = fVar109 * *(float *)(*pauVar5 + 0x10);
          auVar200._20_4_ = fVar172 * *(float *)(*pauVar5 + 0x14);
          auVar200._28_36_ = auVar165._28_36_;
          auVar200._24_4_ = fVar173 * *(float *)(*pauVar5 + 0x18);
          auVar17 = vfmadd231ps_fma(auVar201._0_32_,auVar164,auVar181._0_32_);
          auVar101 = auVar187._0_32_;
          auVar18 = vfmadd231ps_fma(auVar200._0_32_,auVar164,auVar101);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar10,auVar210._0_32_);
          auVar126 = auVar129._0_32_;
          auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar10,auVar126);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar155,auVar192._0_32_);
          auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar155,local_460);
          auVar98 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar89 * 4 + lVar26);
          auVar124 = *(undefined1 (*) [32])(lVar26 + 0x2232c10 + lVar89 * 4);
          auVar160 = *(undefined1 (*) [32])(lVar26 + 0x2233094 + lVar89 * 4);
          pfVar6 = (float *)(lVar26 + 0x2233518 + lVar89 * 4);
          fVar106 = *pfVar6;
          fVar108 = pfVar6[1];
          fVar110 = pfVar6[2];
          fVar111 = pfVar6[3];
          fVar112 = pfVar6[4];
          fVar113 = pfVar6[5];
          fVar196 = pfVar6[6];
          auVar203._0_4_ = fVar106 * local_720;
          auVar203._4_4_ = fVar108 * fStack_71c;
          auVar203._8_4_ = fVar110 * fStack_718;
          auVar203._12_4_ = fVar111 * fStack_714;
          auVar203._16_4_ = fVar112 * fStack_710;
          auVar203._20_4_ = fVar113 * fStack_70c;
          auVar203._28_36_ = auVar204._28_36_;
          auVar203._24_4_ = fVar196 * fStack_708;
          auVar25._4_4_ = fVar108 * fVar219;
          auVar25._0_4_ = fVar106 * fVar217;
          auVar25._8_4_ = fVar110 * fVar105;
          auVar25._12_4_ = fVar111 * fVar107;
          auVar25._16_4_ = fVar112 * fVar109;
          auVar25._20_4_ = fVar113 * fVar172;
          auVar25._24_4_ = fVar196 * fVar173;
          auVar25._28_4_ = auVar155._28_4_;
          auVar20 = vfmadd231ps_fma(auVar203._0_32_,auVar160,auVar181._0_32_);
          auVar21 = vfmadd231ps_fma(auVar25,auVar160,auVar101);
          auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar124,auVar210._0_32_);
          auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar124,auVar126);
          auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar98,auVar192._0_32_);
          auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar98,local_460);
          auVar120 = ZEXT1632(auVar20);
          auVar119 = ZEXT1632(auVar17);
          auVar19 = vsubps_avx(auVar120,auVar119);
          auVar142 = ZEXT1632(auVar21);
          auVar99 = ZEXT1632(auVar18);
          auVar24 = vsubps_avx(auVar142,auVar99);
          auVar43._4_4_ = auVar19._4_4_ * auVar18._4_4_;
          auVar43._0_4_ = auVar19._0_4_ * auVar18._0_4_;
          auVar43._8_4_ = auVar19._8_4_ * auVar18._8_4_;
          auVar43._12_4_ = auVar19._12_4_ * auVar18._12_4_;
          auVar43._16_4_ = auVar19._16_4_ * 0.0;
          auVar43._20_4_ = auVar19._20_4_ * 0.0;
          auVar43._24_4_ = auVar19._24_4_ * 0.0;
          auVar43._28_4_ = auVar181._28_4_;
          fVar131 = auVar24._0_4_;
          auVar165._0_4_ = auVar17._0_4_ * fVar131;
          fVar105 = auVar24._4_4_;
          auVar165._4_4_ = auVar17._4_4_ * fVar105;
          fVar107 = auVar24._8_4_;
          auVar165._8_4_ = auVar17._8_4_ * fVar107;
          fVar109 = auVar24._12_4_;
          auVar165._12_4_ = auVar17._12_4_ * fVar109;
          fVar172 = auVar24._16_4_;
          auVar165._16_4_ = fVar172 * 0.0;
          fVar173 = auVar24._20_4_;
          auVar165._20_4_ = fVar173 * 0.0;
          fVar130 = auVar24._24_4_;
          auVar165._28_36_ = auVar129._28_36_;
          auVar165._24_4_ = fVar130 * 0.0;
          auVar200 = ZEXT3264(auVar164);
          auVar25 = vsubps_avx(auVar43,auVar165._0_32_);
          local_7a0._0_4_ = auVar80._0_4_;
          local_7a0._4_4_ = auVar80._4_4_;
          fStack_798 = auVar80._8_4_;
          fStack_794 = auVar80._12_4_;
          fStack_790 = auVar80._16_4_;
          fStack_78c = auVar80._20_4_;
          fStack_788 = auVar80._24_4_;
          auVar44._4_4_ = local_e0._4_4_ * (float)local_7a0._4_4_;
          auVar44._0_4_ = (float)local_e0 * (float)local_7a0._0_4_;
          auVar44._8_4_ = (float)uStack_d8 * fStack_798;
          auVar44._12_4_ = uStack_d8._4_4_ * fStack_794;
          auVar44._16_4_ = (float)uStack_d0 * fStack_790;
          auVar44._20_4_ = uStack_d0._4_4_ * fStack_78c;
          auVar44._24_4_ = (float)uStack_c8 * fStack_788;
          auVar44._28_4_ = auVar129._28_4_;
          auVar17 = vfmadd231ps_fma(auVar44,auVar164,local_c0);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),local_a0,auVar10);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),local_80,auVar155);
          auVar45._4_4_ = local_e0._4_4_ * fVar108;
          auVar45._0_4_ = (float)local_e0 * fVar106;
          auVar45._8_4_ = (float)uStack_d8 * fVar110;
          auVar45._12_4_ = uStack_d8._4_4_ * fVar111;
          auVar45._16_4_ = (float)uStack_d0 * fVar112;
          auVar45._20_4_ = uStack_d0._4_4_ * fVar113;
          auVar45._24_4_ = (float)uStack_c8 * fVar196;
          auVar45._28_4_ = uStack_c8._4_4_;
          auVar18 = vfmadd231ps_fma(auVar45,auVar160,local_c0);
          auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar124,local_a0);
          auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar98,local_80);
          auVar204 = ZEXT1664(auVar18);
          auVar192._0_4_ = fVar131 * fVar131;
          auVar192._4_4_ = fVar105 * fVar105;
          auVar192._8_4_ = fVar107 * fVar107;
          auVar192._12_4_ = fVar109 * fVar109;
          auVar192._16_4_ = fVar172 * fVar172;
          auVar192._20_4_ = fVar173 * fVar173;
          auVar192._28_36_ = auVar187._28_36_;
          auVar192._24_4_ = fVar130 * fVar130;
          auVar20 = vfmadd231ps_fma(auVar192._0_32_,auVar19,auVar19);
          auVar127 = ZEXT1632(auVar17);
          auVar139 = ZEXT1632(auVar18);
          auVar186 = vmaxps_avx(auVar127,auVar139);
          auVar183._0_4_ = auVar186._0_4_ * auVar186._0_4_ * auVar20._0_4_;
          auVar183._4_4_ = auVar186._4_4_ * auVar186._4_4_ * auVar20._4_4_;
          auVar183._8_4_ = auVar186._8_4_ * auVar186._8_4_ * auVar20._8_4_;
          auVar183._12_4_ = auVar186._12_4_ * auVar186._12_4_ * auVar20._12_4_;
          auVar183._16_4_ = auVar186._16_4_ * auVar186._16_4_ * 0.0;
          auVar183._20_4_ = auVar186._20_4_ * auVar186._20_4_ * 0.0;
          auVar183._24_4_ = auVar186._24_4_ * auVar186._24_4_ * 0.0;
          auVar183._28_4_ = 0;
          auVar46._4_4_ = auVar25._4_4_ * auVar25._4_4_;
          auVar46._0_4_ = auVar25._0_4_ * auVar25._0_4_;
          auVar46._8_4_ = auVar25._8_4_ * auVar25._8_4_;
          auVar46._12_4_ = auVar25._12_4_ * auVar25._12_4_;
          auVar46._16_4_ = auVar25._16_4_ * auVar25._16_4_;
          auVar46._20_4_ = auVar25._20_4_ * auVar25._20_4_;
          auVar46._24_4_ = auVar25._24_4_ * auVar25._24_4_;
          auVar46._28_4_ = auVar25._28_4_;
          auVar186 = vcmpps_avx(auVar46,auVar183,2);
          local_280 = (int)lVar89;
          auVar184._4_4_ = local_280;
          auVar184._0_4_ = local_280;
          auVar184._8_4_ = local_280;
          auVar184._12_4_ = local_280;
          auVar184._16_4_ = local_280;
          auVar184._20_4_ = local_280;
          auVar184._24_4_ = local_280;
          auVar184._28_4_ = local_280;
          auVar25 = vpor_avx2(auVar184,_DAT_0205a920);
          auVar100 = vpcmpgtd_avx2(_local_540,auVar25);
          auVar25 = auVar100 & auVar186;
          fVar217 = (float)local_680;
          fVar219 = local_680._4_4_;
          fVar105 = (float)uStack_678;
          fVar107 = uStack_678._4_4_;
          fVar109 = (float)uStack_670;
          fVar172 = uStack_670._4_4_;
          fVar173 = (float)uStack_668;
          if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar25 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar25 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar25 >> 0x7f,0) == '\0') &&
                (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar25 >> 0xbf,0) == '\0') &&
              (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar25[0x1f]) {
            auVar129 = ZEXT3264(auVar126);
            auVar181 = ZEXT3264(local_7c0);
            auVar187 = ZEXT3264(auVar101);
            auVar210 = ZEXT3264(local_740);
            auVar192 = ZEXT3264(local_760);
            auVar165 = ZEXT3264(local_780);
            _local_7a0 = *pauVar5;
          }
          else {
            local_420 = vandps_avx(auVar100,auVar186);
            auVar47._4_4_ = (float)local_560._4_4_ * fVar108;
            auVar47._0_4_ = (float)local_560._0_4_ * fVar106;
            auVar47._8_4_ = fStack_558 * fVar110;
            auVar47._12_4_ = fStack_554 * fVar111;
            auVar47._16_4_ = fStack_550 * fVar112;
            auVar47._20_4_ = fStack_54c * fVar113;
            auVar47._24_4_ = fStack_548 * fVar196;
            auVar47._28_4_ = auVar186._28_4_;
            auVar17 = vfmadd213ps_fma(auVar160,local_140,auVar47);
            auVar17 = vfmadd213ps_fma(auVar124,local_6c0,ZEXT1632(auVar17));
            auVar17 = vfmadd132ps_fma(auVar98,ZEXT1632(auVar17),local_4a0);
            auVar48._4_4_ = (float)local_560._4_4_ * (float)local_7a0._4_4_;
            auVar48._0_4_ = (float)local_560._0_4_ * (float)local_7a0._0_4_;
            auVar48._8_4_ = fStack_558 * fStack_798;
            auVar48._12_4_ = fStack_554 * fStack_794;
            auVar48._16_4_ = fStack_550 * fStack_790;
            auVar48._20_4_ = fStack_54c * fStack_78c;
            auVar48._24_4_ = fStack_548 * fStack_788;
            auVar48._28_4_ = auVar186._28_4_;
            auVar20 = vfmadd213ps_fma(auVar164,local_140,auVar48);
            auVar20 = vfmadd213ps_fma(auVar10,local_6c0,ZEXT1632(auVar20));
            auVar10 = *(undefined1 (*) [32])(lVar26 + 0x223157c + lVar89 * 4);
            auVar164 = *(undefined1 (*) [32])(lVar26 + 0x2231a00 + lVar89 * 4);
            auVar98 = *(undefined1 (*) [32])(lVar26 + 0x2231e84 + lVar89 * 4);
            pfVar7 = (float *)(lVar26 + 0x2232308 + lVar89 * 4);
            fVar131 = *pfVar7;
            fVar130 = pfVar7[1];
            fVar106 = pfVar7[2];
            fVar108 = pfVar7[3];
            fVar110 = pfVar7[4];
            fVar111 = pfVar7[5];
            fVar112 = pfVar7[6];
            auVar49._4_4_ = fVar130 * fStack_71c;
            auVar49._0_4_ = fVar131 * local_720;
            auVar49._8_4_ = fVar106 * fStack_718;
            auVar49._12_4_ = fVar108 * fStack_714;
            auVar49._16_4_ = fVar110 * fStack_710;
            auVar49._20_4_ = fVar111 * fStack_70c;
            auVar49._24_4_ = fVar112 * fStack_708;
            auVar49._28_4_ = pfVar6[7];
            auVar198._0_4_ = fVar131 * (float)local_680;
            auVar198._4_4_ = fVar130 * local_680._4_4_;
            auVar198._8_4_ = fVar106 * (float)uStack_678;
            auVar198._12_4_ = fVar108 * uStack_678._4_4_;
            auVar198._16_4_ = fVar110 * (float)uStack_670;
            auVar198._20_4_ = fVar111 * uStack_670._4_4_;
            auVar198._24_4_ = fVar112 * (float)uStack_668;
            auVar198._28_4_ = 0;
            auVar50._4_4_ = (float)local_560._4_4_ * fVar130;
            auVar50._0_4_ = (float)local_560._0_4_ * fVar131;
            auVar50._8_4_ = fStack_558 * fVar106;
            auVar50._12_4_ = fStack_554 * fVar108;
            auVar50._16_4_ = fStack_550 * fVar110;
            auVar50._20_4_ = fStack_54c * fVar111;
            auVar50._24_4_ = fStack_548 * fVar112;
            auVar50._28_4_ = pfVar7[7];
            auVar22 = vfmadd231ps_fma(auVar49,auVar98,local_7c0);
            auVar23 = vfmadd231ps_fma(auVar198,auVar98,auVar101);
            auVar96 = vfmadd231ps_fma(auVar50,local_140,auVar98);
            auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar164,local_740);
            auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),auVar164,local_6a0);
            auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),local_6c0,auVar164);
            auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar10,local_760);
            auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),auVar10,local_460);
            auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar10,local_4a0);
            pfVar6 = (float *)(lVar26 + 0x2234728 + lVar89 * 4);
            fVar131 = *pfVar6;
            fVar130 = pfVar6[1];
            fVar106 = pfVar6[2];
            fVar108 = pfVar6[3];
            fVar110 = pfVar6[4];
            fVar111 = pfVar6[5];
            fVar112 = pfVar6[6];
            auVar51._4_4_ = fStack_71c * fVar130;
            auVar51._0_4_ = local_720 * fVar131;
            auVar51._8_4_ = fStack_718 * fVar106;
            auVar51._12_4_ = fStack_714 * fVar108;
            auVar51._16_4_ = fStack_710 * fVar110;
            auVar51._20_4_ = fStack_70c * fVar111;
            auVar51._24_4_ = fStack_708 * fVar112;
            auVar51._28_4_ = auVar19._28_4_;
            auVar52._4_4_ = local_680._4_4_ * fVar130;
            auVar52._0_4_ = (float)local_680 * fVar131;
            auVar52._8_4_ = (float)uStack_678 * fVar106;
            auVar52._12_4_ = uStack_678._4_4_ * fVar108;
            auVar52._16_4_ = (float)uStack_670 * fVar110;
            auVar52._20_4_ = uStack_670._4_4_ * fVar111;
            auVar52._24_4_ = (float)uStack_668 * fVar112;
            auVar52._28_4_ = auVar24._28_4_;
            auVar53._4_4_ = (float)local_560._4_4_ * fVar130;
            auVar53._0_4_ = (float)local_560._0_4_ * fVar131;
            auVar53._8_4_ = fStack_558 * fVar106;
            auVar53._12_4_ = fStack_554 * fVar108;
            auVar53._16_4_ = fStack_550 * fVar110;
            auVar53._20_4_ = fStack_54c * fVar111;
            auVar53._24_4_ = fStack_548 * fVar112;
            auVar53._28_4_ = pfVar6[7];
            auVar10 = *(undefined1 (*) [32])(lVar26 + 0x22342a4 + lVar89 * 4);
            auVar95 = vfmadd231ps_fma(auVar51,auVar10,local_7c0);
            auVar132 = vfmadd231ps_fma(auVar52,auVar10,auVar101);
            auVar115 = vfmadd231ps_fma(auVar53,local_140,auVar10);
            auVar10 = *(undefined1 (*) [32])(lVar26 + 0x2233e20 + lVar89 * 4);
            auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar10,local_740);
            auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar10,local_6a0);
            auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),auVar10,local_6c0);
            auVar10 = *(undefined1 (*) [32])(lVar26 + 0x223399c + lVar89 * 4);
            auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar10,local_760);
            auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar10,local_460);
            auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),local_4a0,auVar10);
            auVar185._8_4_ = 0x7fffffff;
            auVar185._0_8_ = 0x7fffffff7fffffff;
            auVar185._12_4_ = 0x7fffffff;
            auVar185._16_4_ = 0x7fffffff;
            auVar185._20_4_ = 0x7fffffff;
            auVar185._24_4_ = 0x7fffffff;
            auVar185._28_4_ = 0x7fffffff;
            auVar10 = vandps_avx(ZEXT1632(auVar22),auVar185);
            auVar164 = vandps_avx(ZEXT1632(auVar23),auVar185);
            auVar164 = vmaxps_avx(auVar10,auVar164);
            auVar10 = vandps_avx(ZEXT1632(auVar96),auVar185);
            auVar10 = vmaxps_avx(auVar164,auVar10);
            auVar10 = vcmpps_avx(auVar10,_local_480,1);
            auVar98 = vblendvps_avx(ZEXT1632(auVar22),auVar19,auVar10);
            auVar124 = vblendvps_avx(ZEXT1632(auVar23),auVar24,auVar10);
            auVar10 = vandps_avx(ZEXT1632(auVar95),auVar185);
            auVar164 = vandps_avx(ZEXT1632(auVar132),auVar185);
            auVar164 = vmaxps_avx(auVar10,auVar164);
            auVar10 = vandps_avx(auVar185,ZEXT1632(auVar115));
            auVar10 = vmaxps_avx(auVar164,auVar10);
            auVar164 = vcmpps_avx(auVar10,_local_480,1);
            auVar10 = vblendvps_avx(ZEXT1632(auVar95),auVar19,auVar164);
            auVar164 = vblendvps_avx(ZEXT1632(auVar132),auVar24,auVar164);
            auVar20 = vfmadd213ps_fma(auVar155,local_4a0,ZEXT1632(auVar20));
            auVar22 = vfmadd213ps_fma(auVar98,auVar98,ZEXT832(0) << 0x20);
            auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar124,auVar124);
            auVar155 = vrsqrtps_avx(ZEXT1632(auVar22));
            fVar131 = auVar155._0_4_;
            fVar130 = auVar155._4_4_;
            fVar106 = auVar155._8_4_;
            fVar108 = auVar155._12_4_;
            fVar110 = auVar155._16_4_;
            fVar111 = auVar155._20_4_;
            fVar112 = auVar155._24_4_;
            auVar54._4_4_ = fVar130 * fVar130 * fVar130 * auVar22._4_4_ * -0.5;
            auVar54._0_4_ = fVar131 * fVar131 * fVar131 * auVar22._0_4_ * -0.5;
            auVar54._8_4_ = fVar106 * fVar106 * fVar106 * auVar22._8_4_ * -0.5;
            auVar54._12_4_ = fVar108 * fVar108 * fVar108 * auVar22._12_4_ * -0.5;
            auVar54._16_4_ = fVar110 * fVar110 * fVar110 * -0.0;
            auVar54._20_4_ = fVar111 * fVar111 * fVar111 * -0.0;
            auVar54._24_4_ = fVar112 * fVar112 * fVar112 * -0.0;
            auVar54._28_4_ = 0;
            auVar209._8_4_ = 0x3fc00000;
            auVar209._0_8_ = 0x3fc000003fc00000;
            auVar209._12_4_ = 0x3fc00000;
            auVar209._16_4_ = 0x3fc00000;
            auVar209._20_4_ = 0x3fc00000;
            auVar209._24_4_ = 0x3fc00000;
            auVar209._28_4_ = 0x3fc00000;
            auVar22 = vfmadd231ps_fma(auVar54,auVar209,auVar155);
            fVar131 = auVar22._0_4_;
            fVar130 = auVar22._4_4_;
            auVar55._4_4_ = auVar124._4_4_ * fVar130;
            auVar55._0_4_ = auVar124._0_4_ * fVar131;
            fVar106 = auVar22._8_4_;
            auVar55._8_4_ = auVar124._8_4_ * fVar106;
            fVar108 = auVar22._12_4_;
            auVar55._12_4_ = auVar124._12_4_ * fVar108;
            auVar55._16_4_ = auVar124._16_4_ * 0.0;
            auVar55._20_4_ = auVar124._20_4_ * 0.0;
            auVar55._24_4_ = auVar124._24_4_ * 0.0;
            auVar55._28_4_ = auVar155._28_4_;
            auVar56._4_4_ = fVar130 * -auVar98._4_4_;
            auVar56._0_4_ = fVar131 * -auVar98._0_4_;
            auVar56._8_4_ = fVar106 * -auVar98._8_4_;
            auVar56._12_4_ = fVar108 * -auVar98._12_4_;
            auVar56._16_4_ = -auVar98._16_4_ * 0.0;
            auVar56._20_4_ = -auVar98._20_4_ * 0.0;
            auVar56._24_4_ = -auVar98._24_4_ * 0.0;
            auVar56._28_4_ = auVar124._28_4_;
            auVar22 = vfmadd213ps_fma(auVar10,auVar10,ZEXT832(0) << 0x20);
            auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar164,auVar164);
            auVar155 = vrsqrtps_avx(ZEXT1632(auVar22));
            auVar57._28_4_ = auVar24._28_4_;
            auVar57._0_28_ =
                 ZEXT1628(CONCAT412(fVar108 * 0.0,
                                    CONCAT48(fVar106 * 0.0,CONCAT44(fVar130 * 0.0,fVar131 * 0.0))));
            fVar131 = auVar155._0_4_;
            fVar130 = auVar155._4_4_;
            fVar106 = auVar155._8_4_;
            fVar108 = auVar155._12_4_;
            fVar110 = auVar155._16_4_;
            fVar111 = auVar155._20_4_;
            fVar112 = auVar155._24_4_;
            auVar58._4_4_ = fVar130 * fVar130 * fVar130 * auVar22._4_4_ * -0.5;
            auVar58._0_4_ = fVar131 * fVar131 * fVar131 * auVar22._0_4_ * -0.5;
            auVar58._8_4_ = fVar106 * fVar106 * fVar106 * auVar22._8_4_ * -0.5;
            auVar58._12_4_ = fVar108 * fVar108 * fVar108 * auVar22._12_4_ * -0.5;
            auVar58._16_4_ = fVar110 * fVar110 * fVar110 * -0.0;
            auVar58._20_4_ = fVar111 * fVar111 * fVar111 * -0.0;
            auVar58._24_4_ = fVar112 * fVar112 * fVar112 * -0.0;
            auVar58._28_4_ = 0;
            auVar22 = vfmadd231ps_fma(auVar58,auVar209,auVar155);
            fVar131 = auVar22._0_4_;
            fVar130 = auVar22._4_4_;
            auVar59._4_4_ = auVar164._4_4_ * fVar130;
            auVar59._0_4_ = auVar164._0_4_ * fVar131;
            fVar106 = auVar22._8_4_;
            auVar59._8_4_ = auVar164._8_4_ * fVar106;
            fVar108 = auVar22._12_4_;
            auVar59._12_4_ = auVar164._12_4_ * fVar108;
            auVar59._16_4_ = auVar164._16_4_ * 0.0;
            auVar59._20_4_ = auVar164._20_4_ * 0.0;
            auVar59._24_4_ = auVar164._24_4_ * 0.0;
            auVar59._28_4_ = 0;
            auVar60._4_4_ = fVar130 * -auVar10._4_4_;
            auVar60._0_4_ = fVar131 * -auVar10._0_4_;
            auVar60._8_4_ = fVar106 * -auVar10._8_4_;
            auVar60._12_4_ = fVar108 * -auVar10._12_4_;
            auVar60._16_4_ = -auVar10._16_4_ * 0.0;
            auVar60._20_4_ = -auVar10._20_4_ * 0.0;
            auVar60._24_4_ = -auVar10._24_4_ * 0.0;
            auVar60._28_4_ = auVar155._28_4_;
            auVar61._28_4_ = 0xbf000000;
            auVar61._0_28_ =
                 ZEXT1628(CONCAT412(fVar108 * 0.0,
                                    CONCAT48(fVar106 * 0.0,CONCAT44(fVar130 * 0.0,fVar131 * 0.0))));
            auVar22 = vfmadd213ps_fma(auVar55,auVar127,auVar119);
            auVar23 = vfmadd213ps_fma(auVar56,auVar127,auVar99);
            auVar96 = vfmadd213ps_fma(auVar57,auVar127,ZEXT1632(auVar20));
            auVar94 = vfnmadd213ps_fma(auVar55,auVar127,auVar119);
            auVar95 = vfmadd213ps_fma(auVar59,auVar139,auVar120);
            auVar116 = vfnmadd213ps_fma(auVar56,auVar127,auVar99);
            auVar132 = vfmadd213ps_fma(auVar60,auVar139,auVar142);
            auVar93 = vfnmadd231ps_fma(ZEXT1632(auVar20),auVar127,auVar57);
            auVar20 = vfmadd213ps_fma(auVar61,auVar139,ZEXT1632(auVar17));
            auVar144 = vfnmadd213ps_fma(auVar59,auVar139,auVar120);
            auVar148 = vfnmadd213ps_fma(auVar60,auVar139,auVar142);
            auVar114 = vfnmadd231ps_fma(ZEXT1632(auVar17),auVar139,auVar61);
            auVar155 = vsubps_avx(ZEXT1632(auVar132),ZEXT1632(auVar116));
            auVar10 = vsubps_avx(ZEXT1632(auVar20),ZEXT1632(auVar93));
            auVar62._4_4_ = auVar155._4_4_ * auVar93._4_4_;
            auVar62._0_4_ = auVar155._0_4_ * auVar93._0_4_;
            auVar62._8_4_ = auVar155._8_4_ * auVar93._8_4_;
            auVar62._12_4_ = auVar155._12_4_ * auVar93._12_4_;
            auVar62._16_4_ = auVar155._16_4_ * 0.0;
            auVar62._20_4_ = auVar155._20_4_ * 0.0;
            auVar62._24_4_ = auVar155._24_4_ * 0.0;
            auVar62._28_4_ = 0;
            auVar115 = vfmsub231ps_fma(auVar62,ZEXT1632(auVar116),auVar10);
            auVar63._4_4_ = auVar94._4_4_ * auVar10._4_4_;
            auVar63._0_4_ = auVar94._0_4_ * auVar10._0_4_;
            auVar63._8_4_ = auVar94._8_4_ * auVar10._8_4_;
            auVar63._12_4_ = auVar94._12_4_ * auVar10._12_4_;
            auVar63._16_4_ = auVar10._16_4_ * 0.0;
            auVar63._20_4_ = auVar10._20_4_ * 0.0;
            auVar63._24_4_ = auVar10._24_4_ * 0.0;
            auVar63._28_4_ = auVar10._28_4_;
            auVar186 = ZEXT1632(auVar94);
            auVar10 = vsubps_avx(ZEXT1632(auVar95),auVar186);
            auVar100 = ZEXT1632(auVar93);
            auVar17 = vfmsub231ps_fma(auVar63,auVar100,auVar10);
            auVar64._4_4_ = auVar116._4_4_ * auVar10._4_4_;
            auVar64._0_4_ = auVar116._0_4_ * auVar10._0_4_;
            auVar64._8_4_ = auVar116._8_4_ * auVar10._8_4_;
            auVar64._12_4_ = auVar116._12_4_ * auVar10._12_4_;
            auVar64._16_4_ = auVar10._16_4_ * 0.0;
            auVar64._20_4_ = auVar10._20_4_ * 0.0;
            auVar64._24_4_ = auVar10._24_4_ * 0.0;
            auVar64._28_4_ = auVar10._28_4_;
            auVar94 = vfmsub231ps_fma(auVar64,auVar186,auVar155);
            auVar17 = vfmadd231ps_fma(ZEXT1632(auVar94),ZEXT832(0) << 0x20,ZEXT1632(auVar17));
            auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),ZEXT832(0) << 0x20,ZEXT1632(auVar115));
            auVar126 = vcmpps_avx(ZEXT1632(auVar17),ZEXT832(0) << 0x20,2);
            auVar155 = vblendvps_avx(ZEXT1632(auVar144),ZEXT1632(auVar22),auVar126);
            auVar10 = vblendvps_avx(ZEXT1632(auVar148),ZEXT1632(auVar23),auVar126);
            auVar164 = vblendvps_avx(ZEXT1632(auVar114),ZEXT1632(auVar96),auVar126);
            auVar98 = vblendvps_avx(auVar186,ZEXT1632(auVar95),auVar126);
            auVar124 = vblendvps_avx(ZEXT1632(auVar116),ZEXT1632(auVar132),auVar126);
            auVar160 = vblendvps_avx(auVar100,ZEXT1632(auVar20),auVar126);
            auVar186 = vblendvps_avx(ZEXT1632(auVar95),auVar186,auVar126);
            auVar25 = vblendvps_avx(ZEXT1632(auVar132),ZEXT1632(auVar116),auVar126);
            auVar17 = vpackssdw_avx(local_420._0_16_,local_420._16_16_);
            auVar100 = vblendvps_avx(ZEXT1632(auVar20),auVar100,auVar126);
            auVar186 = vsubps_avx(auVar186,auVar155);
            auVar25 = vsubps_avx(auVar25,auVar10);
            auVar142 = vsubps_avx(auVar100,auVar164);
            auVar200 = ZEXT3264(auVar142);
            auVar99 = vsubps_avx(auVar155,auVar98);
            auVar101 = vsubps_avx(auVar10,auVar124);
            auVar119 = vsubps_avx(auVar164,auVar160);
            auVar161._0_4_ = auVar142._0_4_ * auVar155._0_4_;
            auVar161._4_4_ = auVar142._4_4_ * auVar155._4_4_;
            auVar161._8_4_ = auVar142._8_4_ * auVar155._8_4_;
            auVar161._12_4_ = auVar142._12_4_ * auVar155._12_4_;
            auVar161._16_4_ = auVar142._16_4_ * auVar155._16_4_;
            auVar161._20_4_ = auVar142._20_4_ * auVar155._20_4_;
            auVar161._24_4_ = auVar142._24_4_ * auVar155._24_4_;
            auVar161._28_4_ = 0;
            auVar20 = vfmsub231ps_fma(auVar161,auVar164,auVar186);
            auVar65._4_4_ = auVar186._4_4_ * auVar10._4_4_;
            auVar65._0_4_ = auVar186._0_4_ * auVar10._0_4_;
            auVar65._8_4_ = auVar186._8_4_ * auVar10._8_4_;
            auVar65._12_4_ = auVar186._12_4_ * auVar10._12_4_;
            auVar65._16_4_ = auVar186._16_4_ * auVar10._16_4_;
            auVar65._20_4_ = auVar186._20_4_ * auVar10._20_4_;
            auVar65._24_4_ = auVar186._24_4_ * auVar10._24_4_;
            auVar65._28_4_ = auVar100._28_4_;
            auVar22 = vfmsub231ps_fma(auVar65,auVar155,auVar25);
            auVar100 = ZEXT1232(ZEXT812(0)) << 0x20;
            auVar20 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar100,ZEXT1632(auVar20));
            auVar162._0_4_ = auVar25._0_4_ * auVar164._0_4_;
            auVar162._4_4_ = auVar25._4_4_ * auVar164._4_4_;
            auVar162._8_4_ = auVar25._8_4_ * auVar164._8_4_;
            auVar162._12_4_ = auVar25._12_4_ * auVar164._12_4_;
            auVar162._16_4_ = auVar25._16_4_ * auVar164._16_4_;
            auVar162._20_4_ = auVar25._20_4_ * auVar164._20_4_;
            auVar162._24_4_ = auVar25._24_4_ * auVar164._24_4_;
            auVar162._28_4_ = 0;
            auVar22 = vfmsub231ps_fma(auVar162,auVar10,auVar142);
            auVar22 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar100,ZEXT1632(auVar22));
            auVar163._0_4_ = auVar119._0_4_ * auVar98._0_4_;
            auVar163._4_4_ = auVar119._4_4_ * auVar98._4_4_;
            auVar163._8_4_ = auVar119._8_4_ * auVar98._8_4_;
            auVar163._12_4_ = auVar119._12_4_ * auVar98._12_4_;
            auVar163._16_4_ = auVar119._16_4_ * auVar98._16_4_;
            auVar163._20_4_ = auVar119._20_4_ * auVar98._20_4_;
            auVar163._24_4_ = auVar119._24_4_ * auVar98._24_4_;
            auVar163._28_4_ = 0;
            auVar20 = vfmsub231ps_fma(auVar163,auVar99,auVar160);
            auVar66._4_4_ = auVar101._4_4_ * auVar160._4_4_;
            auVar66._0_4_ = auVar101._0_4_ * auVar160._0_4_;
            auVar66._8_4_ = auVar101._8_4_ * auVar160._8_4_;
            auVar66._12_4_ = auVar101._12_4_ * auVar160._12_4_;
            auVar66._16_4_ = auVar101._16_4_ * auVar160._16_4_;
            auVar66._20_4_ = auVar101._20_4_ * auVar160._20_4_;
            auVar66._24_4_ = auVar101._24_4_ * auVar160._24_4_;
            auVar66._28_4_ = auVar160._28_4_;
            auVar23 = vfmsub231ps_fma(auVar66,auVar124,auVar119);
            auVar67._4_4_ = auVar99._4_4_ * auVar124._4_4_;
            auVar67._0_4_ = auVar99._0_4_ * auVar124._0_4_;
            auVar67._8_4_ = auVar99._8_4_ * auVar124._8_4_;
            auVar67._12_4_ = auVar99._12_4_ * auVar124._12_4_;
            auVar67._16_4_ = auVar99._16_4_ * auVar124._16_4_;
            auVar67._20_4_ = auVar99._20_4_ * auVar124._20_4_;
            auVar67._24_4_ = auVar99._24_4_ * auVar124._24_4_;
            auVar67._28_4_ = auVar124._28_4_;
            auVar96 = vfmsub231ps_fma(auVar67,auVar101,auVar98);
            auVar98 = ZEXT1232(ZEXT812(0)) << 0x20;
            auVar20 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar98,ZEXT1632(auVar20));
            auVar23 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar98,ZEXT1632(auVar23));
            auVar98 = vmaxps_avx(ZEXT1632(auVar22),ZEXT1632(auVar23));
            auVar98 = vcmpps_avx(auVar98,ZEXT832(0) << 0x20,2);
            auVar20 = vpackssdw_avx(auVar98._0_16_,auVar98._16_16_);
            auVar20 = vpand_avx(auVar20,auVar17);
            auVar98 = vpmovsxwd_avx2(auVar20);
            if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar98 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar98 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar98 >> 0x7f,0) == '\0') &&
                  (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar98 >> 0xbf,0) == '\0') &&
                (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar98[0x1f]) {
LAB_016cc3bd:
              auVar146._8_8_ = uStack_4b8;
              auVar146._0_8_ = local_4c0;
              auVar146._16_8_ = uStack_4b0;
              auVar146._24_8_ = uStack_4a8;
            }
            else {
              auVar68._4_4_ = auVar25._4_4_ * auVar119._4_4_;
              auVar68._0_4_ = auVar25._0_4_ * auVar119._0_4_;
              auVar68._8_4_ = auVar25._8_4_ * auVar119._8_4_;
              auVar68._12_4_ = auVar25._12_4_ * auVar119._12_4_;
              auVar68._16_4_ = auVar25._16_4_ * auVar119._16_4_;
              auVar68._20_4_ = auVar25._20_4_ * auVar119._20_4_;
              auVar68._24_4_ = auVar25._24_4_ * auVar119._24_4_;
              auVar68._28_4_ = auVar98._28_4_;
              auVar115 = vfmsub231ps_fma(auVar68,auVar101,auVar142);
              auVar171._0_4_ = auVar142._0_4_ * auVar99._0_4_;
              auVar171._4_4_ = auVar142._4_4_ * auVar99._4_4_;
              auVar171._8_4_ = auVar142._8_4_ * auVar99._8_4_;
              auVar171._12_4_ = auVar142._12_4_ * auVar99._12_4_;
              auVar171._16_4_ = auVar142._16_4_ * auVar99._16_4_;
              auVar171._20_4_ = auVar142._20_4_ * auVar99._20_4_;
              auVar171._24_4_ = auVar142._24_4_ * auVar99._24_4_;
              auVar171._28_4_ = 0;
              auVar132 = vfmsub231ps_fma(auVar171,auVar186,auVar119);
              auVar69._4_4_ = auVar186._4_4_ * auVar101._4_4_;
              auVar69._0_4_ = auVar186._0_4_ * auVar101._0_4_;
              auVar69._8_4_ = auVar186._8_4_ * auVar101._8_4_;
              auVar69._12_4_ = auVar186._12_4_ * auVar101._12_4_;
              auVar69._16_4_ = auVar186._16_4_ * auVar101._16_4_;
              auVar69._20_4_ = auVar186._20_4_ * auVar101._20_4_;
              auVar69._24_4_ = auVar186._24_4_ * auVar101._24_4_;
              auVar69._28_4_ = auVar101._28_4_;
              auVar94 = vfmsub231ps_fma(auVar69,auVar99,auVar25);
              auVar96 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar132),ZEXT1632(auVar94));
              auVar95 = vfmadd231ps_fma(ZEXT1632(auVar96),ZEXT1632(auVar115),ZEXT832(0) << 0x20);
              auVar98 = vrcpps_avx(ZEXT1632(auVar95));
              auVar199._8_4_ = 0x3f800000;
              auVar199._0_8_ = &DAT_3f8000003f800000;
              auVar199._12_4_ = 0x3f800000;
              auVar199._16_4_ = 0x3f800000;
              auVar199._20_4_ = 0x3f800000;
              auVar199._24_4_ = 0x3f800000;
              auVar199._28_4_ = 0x3f800000;
              auVar200 = ZEXT3264(auVar199);
              auVar96 = vfnmadd213ps_fma(auVar98,ZEXT1632(auVar95),auVar199);
              auVar96 = vfmadd132ps_fma(ZEXT1632(auVar96),auVar98,auVar98);
              auVar70._4_4_ = auVar94._4_4_ * auVar164._4_4_;
              auVar70._0_4_ = auVar94._0_4_ * auVar164._0_4_;
              auVar70._8_4_ = auVar94._8_4_ * auVar164._8_4_;
              auVar70._12_4_ = auVar94._12_4_ * auVar164._12_4_;
              auVar70._16_4_ = auVar164._16_4_ * 0.0;
              auVar70._20_4_ = auVar164._20_4_ * 0.0;
              auVar70._24_4_ = auVar164._24_4_ * 0.0;
              auVar70._28_4_ = auVar164._28_4_;
              auVar132 = vfmadd231ps_fma(auVar70,auVar10,ZEXT1632(auVar132));
              auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar155,ZEXT1632(auVar115));
              fVar131 = auVar96._0_4_;
              fVar130 = auVar96._4_4_;
              fVar106 = auVar96._8_4_;
              fVar108 = auVar96._12_4_;
              auVar164 = ZEXT1632(CONCAT412(fVar108 * auVar132._12_4_,
                                            CONCAT48(fVar106 * auVar132._8_4_,
                                                     CONCAT44(fVar130 * auVar132._4_4_,
                                                              fVar131 * auVar132._0_4_))));
              uVar91 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar145._4_4_ = uVar91;
              auVar145._0_4_ = uVar91;
              auVar145._8_4_ = uVar91;
              auVar145._12_4_ = uVar91;
              auVar145._16_4_ = uVar91;
              auVar145._20_4_ = uVar91;
              auVar145._24_4_ = uVar91;
              auVar145._28_4_ = uVar91;
              auVar79._4_4_ = uStack_fc;
              auVar79._0_4_ = local_100;
              auVar79._8_4_ = uStack_f8;
              auVar79._12_4_ = uStack_f4;
              auVar79._16_4_ = uStack_f0;
              auVar79._20_4_ = uStack_ec;
              auVar79._24_4_ = uStack_e8;
              auVar79._28_4_ = uStack_e4;
              auVar155 = vcmpps_avx(auVar79,auVar164,2);
              auVar10 = vcmpps_avx(auVar164,auVar145,2);
              auVar155 = vandps_avx(auVar10,auVar155);
              auVar96 = vpackssdw_avx(auVar155._0_16_,auVar155._16_16_);
              auVar20 = vpand_avx(auVar20,auVar96);
              auVar155 = vpmovsxwd_avx2(auVar20);
              if ((((((((auVar155 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar155 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar155 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar155 >> 0x7f,0) == '\0') &&
                    (auVar155 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar155 >> 0xbf,0) == '\0') &&
                  (auVar155 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar155[0x1f]) goto LAB_016cc3bd;
              auVar155 = vcmpps_avx(ZEXT1632(auVar95),ZEXT832(0) << 0x20,4);
              auVar96 = vpackssdw_avx(auVar155._0_16_,auVar155._16_16_);
              auVar20 = vpand_avx(auVar20,auVar96);
              auVar155 = vpmovsxwd_avx2(auVar20);
              auVar146._8_8_ = uStack_4b8;
              auVar146._0_8_ = local_4c0;
              auVar146._16_8_ = uStack_4b0;
              auVar146._24_8_ = uStack_4a8;
              if ((((((((auVar155 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar155 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar155 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar155 >> 0x7f,0) != '\0') ||
                    (auVar155 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar155 >> 0xbf,0) != '\0') ||
                  (auVar155 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar155[0x1f] < '\0') {
                auVar98 = ZEXT1632(CONCAT412(fVar108 * auVar22._12_4_,
                                             CONCAT48(fVar106 * auVar22._8_4_,
                                                      CONCAT44(fVar130 * auVar22._4_4_,
                                                               fVar131 * auVar22._0_4_))));
                auVar71._28_4_ = SUB84(uStack_4a8,4);
                auVar71._0_28_ =
                     ZEXT1628(CONCAT412(fVar108 * auVar23._12_4_,
                                        CONCAT48(fVar106 * auVar23._8_4_,
                                                 CONCAT44(fVar130 * auVar23._4_4_,
                                                          fVar131 * auVar23._0_4_))));
                auVar180._8_4_ = 0x3f800000;
                auVar180._0_8_ = &DAT_3f8000003f800000;
                auVar180._12_4_ = 0x3f800000;
                auVar180._16_4_ = 0x3f800000;
                auVar180._20_4_ = 0x3f800000;
                auVar180._24_4_ = 0x3f800000;
                auVar180._28_4_ = 0x3f800000;
                auVar10 = vsubps_avx(auVar180,auVar98);
                _local_180 = vblendvps_avx(auVar10,auVar98,auVar126);
                auVar10 = vsubps_avx(auVar180,auVar71);
                local_360 = vblendvps_avx(auVar10,auVar71,auVar126);
                local_1a0 = auVar164;
                auVar146 = auVar155;
              }
            }
            auVar210 = ZEXT3264(local_740);
            auVar204 = ZEXT3264(auVar139);
            auVar192 = ZEXT3264(local_760);
            _local_7a0 = auVar139;
            local_440 = auVar24;
            if ((((((((auVar146 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar146 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar146 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar146 >> 0x7f,0) != '\0') ||
                  (auVar146 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar146 >> 0xbf,0) != '\0') ||
                (auVar146 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar146[0x1f] < '\0') {
              auVar155 = vsubps_avx(auVar139,auVar127);
              auVar20 = vfmadd213ps_fma(auVar155,_local_180,auVar127);
              fVar131 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
              auVar72._4_4_ = (auVar20._4_4_ + auVar20._4_4_) * fVar131;
              auVar72._0_4_ = (auVar20._0_4_ + auVar20._0_4_) * fVar131;
              auVar72._8_4_ = (auVar20._8_4_ + auVar20._8_4_) * fVar131;
              auVar72._12_4_ = (auVar20._12_4_ + auVar20._12_4_) * fVar131;
              auVar72._16_4_ = fVar131 * 0.0;
              auVar72._20_4_ = fVar131 * 0.0;
              auVar72._24_4_ = fVar131 * 0.0;
              auVar72._28_4_ = fVar131;
              auVar155 = vcmpps_avx(local_1a0,auVar72,6);
              auVar10 = auVar146 & auVar155;
              auVar181 = ZEXT3264(local_7c0);
              if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar10 >> 0x7f,0) != '\0') ||
                    (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar10 >> 0xbf,0) != '\0') ||
                  (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar10[0x1f] < '\0') {
                local_220 = vandps_avx(auVar155,auVar146);
                auVar128._8_4_ = 0xbf800000;
                auVar128._0_8_ = 0xbf800000bf800000;
                auVar128._12_4_ = 0xbf800000;
                auVar128._16_4_ = 0xbf800000;
                auVar128._20_4_ = 0xbf800000;
                auVar128._24_4_ = 0xbf800000;
                auVar128._28_4_ = 0xbf800000;
                auVar143._8_4_ = 0x40000000;
                auVar143._0_8_ = 0x4000000040000000;
                auVar143._12_4_ = 0x40000000;
                auVar143._16_4_ = 0x40000000;
                auVar143._20_4_ = 0x40000000;
                auVar143._24_4_ = 0x40000000;
                auVar143._28_4_ = 0x40000000;
                auVar20 = vfmadd213ps_fma(local_360,auVar143,auVar128);
                local_2e0 = _local_180;
                local_2c0 = ZEXT1632(auVar20);
                local_2a0 = local_1a0;
                local_270 = local_6f0;
                uStack_268 = uStack_6e8;
                local_260 = local_570;
                uStack_258 = uStack_568;
                local_250 = local_580;
                uStack_248 = uStack_578;
                local_240 = local_590;
                uStack_238 = uStack_588;
                pGVar14 = (context->scene->geometries).items[local_7c8].ptr;
                auVar187 = ZEXT3264(local_5e0);
                local_360 = local_2c0;
                if ((pGVar14->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  bVar82 = 0;
                  auVar129 = ZEXT3264(local_6a0);
                  auVar165 = ZEXT3264(local_780);
                }
                else {
                  auVar129 = ZEXT3264(local_6a0);
                  if (context->args->filter == (RTCFilterFunctionN)0x0) {
                    auVar165 = ZEXT3264(local_780);
                    bVar82 = 1;
                    if (pGVar14->occlusionFilterN == (RTCFilterFunctionN)0x0) goto LAB_016cc3ac;
                  }
                  _local_7a0 = ZEXT1632(CONCAT88(auVar18._8_8_,pGVar14));
                  local_600 = ZEXT1632(CONCAT124(auVar21._4_12_,(int)uVar88));
                  fVar131 = (float)local_280;
                  local_200[0] = (fVar131 + (float)local_180._0_4_ + 0.0) * local_120;
                  local_200[1] = (fVar131 + (float)local_180._4_4_ + 1.0) * fStack_11c;
                  local_200[2] = (fVar131 + fStack_178 + 2.0) * fStack_118;
                  local_200[3] = (fVar131 + fStack_174 + 3.0) * fStack_114;
                  fStack_1f0 = (fVar131 + fStack_170 + 4.0) * fStack_110;
                  fStack_1ec = (fVar131 + fStack_16c + 5.0) * fStack_10c;
                  fStack_1e8 = (fVar131 + fStack_168 + 6.0) * fStack_108;
                  fStack_1e4 = fVar131 + fStack_164 + 7.0;
                  local_360._0_8_ = auVar20._0_8_;
                  local_360._8_8_ = auVar20._8_8_;
                  local_1e0 = local_360._0_8_;
                  uStack_1d8 = local_360._8_8_;
                  uStack_1d0 = 0;
                  uStack_1c8 = 0;
                  local_1c0 = local_1a0;
                  uVar83 = vmovmskps_avx(local_220);
                  local_6e0._4_28_ = auVar19._4_28_;
                  local_6e0._0_4_ = (int)CONCAT71((int7)((ulong)pGVar14 >> 8),uVar83 != 0);
                  if (uVar83 != 0) {
                    uVar85 = (ulong)(uVar83 & 0xff);
                    local_820 = ZEXT1632(CONCAT88(auVar114._8_8_,uVar85));
                    lVar27 = 0;
                    for (; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x8000000000000000) {
                      lVar27 = lVar27 + 1;
                    }
                    local_860 = ZEXT1632(CONCAT88(auVar17._8_8_,lVar27));
                    local_5c0._0_16_ = CONCAT88(uStack_568,local_570);
                    local_5c0 = ZEXT1632(local_5c0._0_16_);
                    local_500._0_16_ = CONCAT88(uStack_578,local_580);
                    local_500 = ZEXT1632(local_500._0_16_);
                    _local_520 = CONCAT88(uStack_588,local_590);
                    _local_520 = ZEXT1632(_local_520);
                    _local_620 = ZEXT1632(*local_658);
                    local_27c = iVar13;
                    do {
                      uVar91 = *(undefined4 *)(ray + k * 4 + 0x80);
                      fVar131 = local_200[local_860._0_8_];
                      local_3c0._4_4_ = fVar131;
                      local_3c0._0_4_ = fVar131;
                      local_3c0._8_4_ = fVar131;
                      local_3c0._12_4_ = fVar131;
                      local_3b0 = *(undefined4 *)((long)&local_1e0 + local_860._0_8_ * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) =
                           *(undefined4 *)(local_1c0 + local_860._0_8_ * 4);
                      fVar105 = 1.0 - fVar131;
                      auVar17 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_3c0,
                                                ZEXT416(0xc0a00000));
                      auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar131 * fVar131 * 3.0)),
                                                ZEXT416((uint)(fVar131 + fVar131)),auVar17);
                      auVar17 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_3c0,
                                                ZEXT416(0x40000000));
                      auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar105 * fVar105 * -3.0)),
                                                ZEXT416((uint)(fVar105 + fVar105)),auVar17);
                      auVar21 = vfnmadd231ss_fma(ZEXT416((uint)(fVar131 * (fVar105 + fVar105))),
                                                 ZEXT416((uint)fVar105),ZEXT416((uint)fVar105));
                      auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar131 * fVar131)),local_3c0,
                                                ZEXT416((uint)(fVar105 * -2.0)));
                      fVar131 = auVar17._0_4_ * 0.5;
                      fVar105 = auVar20._0_4_ * 0.5;
                      auVar152._0_4_ = fVar105 * (float)local_520._0_4_;
                      auVar152._4_4_ = fVar105 * (float)local_520._4_4_;
                      auVar152._8_4_ = fVar105 * (float)uStack_518;
                      auVar152._12_4_ = fVar105 * uStack_518._4_4_;
                      auVar136._4_4_ = fVar131;
                      auVar136._0_4_ = fVar131;
                      auVar136._8_4_ = fVar131;
                      auVar136._12_4_ = fVar131;
                      auVar17 = vfmadd132ps_fma(auVar136,auVar152,local_500._0_16_);
                      fVar131 = auVar18._0_4_ * 0.5;
                      auVar153._4_4_ = fVar131;
                      auVar153._0_4_ = fVar131;
                      auVar153._8_4_ = fVar131;
                      auVar153._12_4_ = fVar131;
                      auVar17 = vfmadd132ps_fma(auVar153,auVar17,local_5c0._0_16_);
                      local_650.context = context->user;
                      fVar131 = auVar21._0_4_ * 0.5;
                      auVar137._4_4_ = fVar131;
                      auVar137._0_4_ = fVar131;
                      auVar137._8_4_ = fVar131;
                      auVar137._12_4_ = fVar131;
                      auVar78._8_8_ = uStack_6e8;
                      auVar78._0_8_ = local_6f0;
                      auVar17 = vfmadd132ps_fma(auVar137,auVar17,auVar78);
                      local_3f0 = auVar17._0_4_;
                      local_3e0 = vshufps_avx(auVar17,auVar17,0x55);
                      local_3d0 = vshufps_avx(auVar17,auVar17,0xaa);
                      local_3a0 = CONCAT44(uStack_31c,local_320);
                      uStack_398 = CONCAT44(uStack_314,uStack_318);
                      local_390._4_4_ = uStack_30c;
                      local_390._0_4_ = local_310;
                      local_390._8_4_ = uStack_308;
                      local_390._12_4_ = uStack_304;
                      vpcmpeqd_avx2(ZEXT1632(local_390),ZEXT1632(local_390));
                      uStack_37c = (local_650.context)->instID[0];
                      local_380 = uStack_37c;
                      uStack_378 = uStack_37c;
                      uStack_374 = uStack_37c;
                      uStack_370 = (local_650.context)->instPrimID[0];
                      uStack_36c = uStack_370;
                      uStack_368 = uStack_370;
                      uStack_364 = uStack_370;
                      local_7e0 = local_620;
                      uStack_7d8 = uStack_618;
                      local_650.valid = (int *)&local_7e0;
                      local_650.geometryUserPtr = *(void **)((long)local_7a0 + 0x18);
                      local_650.hit = (RTCHitN *)&local_3f0;
                      local_650.N = 4;
                      local_650.ray = (RTCRayN *)ray;
                      uStack_3ec = local_3f0;
                      uStack_3e8 = local_3f0;
                      uStack_3e4 = local_3f0;
                      uStack_3ac = local_3b0;
                      uStack_3a8 = local_3b0;
                      uStack_3a4 = local_3b0;
                      if (*(code **)((long)local_7a0 + 0x48) != (code *)0x0) {
                        auVar200 = ZEXT1664(auVar200._0_16_);
                        auVar204 = ZEXT1664(auVar204._0_16_);
                        (**(code **)((long)local_7a0 + 0x48))(&local_650);
                      }
                      auVar75._8_8_ = uStack_7d8;
                      auVar75._0_8_ = local_7e0;
                      if (auVar75 == (undefined1  [16])0x0) {
                        auVar17 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                        auVar17 = auVar17 ^ _DAT_01febe20;
                      }
                      else {
                        p_Var16 = context->args->filter;
                        if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            ((*(byte *)((long)local_7a0 + 0x3e) & 0x40) != 0)))) {
                          auVar200 = ZEXT1664(auVar200._0_16_);
                          auVar204 = ZEXT1664(auVar204._0_16_);
                          (*p_Var16)(&local_650);
                        }
                        auVar76._8_8_ = uStack_7d8;
                        auVar76._0_8_ = local_7e0;
                        auVar18 = vpcmpeqd_avx((undefined1  [16])0x0,auVar76);
                        auVar17 = auVar18 ^ _DAT_01febe20;
                        auVar138._8_4_ = 0xff800000;
                        auVar138._0_8_ = 0xff800000ff800000;
                        auVar138._12_4_ = 0xff800000;
                        auVar18 = vblendvps_avx(auVar138,*(undefined1 (*) [16])
                                                          (local_650.ray + 0x80),auVar18);
                        *(undefined1 (*) [16])(local_650.ray + 0x80) = auVar18;
                      }
                      auVar118._8_8_ = 0x100000001;
                      auVar118._0_8_ = 0x100000001;
                      if ((auVar118 & auVar17) != (undefined1  [16])0x0) break;
                      *(undefined4 *)(ray + k * 4 + 0x80) = uVar91;
                      uVar88 = local_820._0_8_ ^ 1L << (local_860._0_8_ & 0x3f);
                      local_820._0_8_ = uVar88;
                      lVar27 = 0;
                      for (uVar85 = uVar88; (uVar85 & 1) == 0;
                          uVar85 = uVar85 >> 1 | 0x8000000000000000) {
                        lVar27 = lVar27 + 1;
                      }
                      local_860._0_8_ = lVar27;
                      local_6e0._0_4_ = (int)CONCAT71((int7)((ulong)lVar27 >> 8),uVar88 != 0);
                    } while (uVar88 != 0);
                  }
                  bVar82 = local_6e0[0] & 1;
                  auVar165 = ZEXT3264(local_780);
                  auVar129 = ZEXT3264(local_6a0);
                  auVar181 = ZEXT3264(local_7c0);
                  auVar187 = ZEXT3264(local_5e0);
                  auVar210 = ZEXT3264(local_740);
                  auVar192 = ZEXT3264(local_760);
                  uVar88 = (ulong)(uint)local_600._0_4_;
                  fVar217 = (float)local_680;
                  fVar219 = local_680._4_4_;
                  fVar105 = (float)uStack_678;
                  fVar107 = uStack_678._4_4_;
                  fVar109 = (float)uStack_670;
                  fVar172 = uStack_670._4_4_;
                  fVar173 = (float)uStack_668;
                }
LAB_016cc3ac:
                uVar88 = CONCAT71((int7)(uVar88 >> 8),(byte)uVar88 | bVar82);
                goto LAB_016cbe3e;
              }
            }
            auVar181 = ZEXT3264(local_7c0);
            auVar129 = ZEXT3264(local_6a0);
            auVar187 = ZEXT3264(local_5e0);
            auVar165 = ZEXT3264(local_780);
          }
LAB_016cbe3e:
          lVar89 = lVar89 + 8;
        } while ((int)lVar89 < iVar13);
      }
      if ((uVar88 & 1) != 0) {
        return local_86d;
      }
      uVar91 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar97._4_4_ = uVar91;
      auVar97._0_4_ = uVar91;
      auVar97._8_4_ = uVar91;
      auVar97._12_4_ = uVar91;
      auVar17 = vcmpps_avx(local_300,auVar97,2);
      uVar83 = vmovmskps_avx(auVar17);
      uVar83 = (uint)uVar90 & uVar83;
      local_86d = uVar83 != 0;
    } while (local_86d);
  }
  return local_86d;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }